

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar67 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  int iVar103;
  float fVar104;
  undefined4 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  vfloat4 a0_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vfloat4 a0_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar130;
  float fVar131;
  vfloat4 a0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar132;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vfloat4 b0;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  __m128 a_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  __m128 a;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar158;
  float fVar166;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  vfloat4 a0_3;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar208;
  float fVar209;
  vfloat4 b0_2;
  undefined1 auVar200 [16];
  float fVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0_4;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 in_ZMM18 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  ulong local_388;
  Primitive *local_380;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  uint auStack_328 [4];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar31;
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar148;
  float fVar157;
  undefined1 auVar236 [32];
  
  PVar5 = prim[1];
  uVar29 = (ulong)(byte)PVar5;
  lVar32 = uVar29 * 0x25;
  fVar122 = *(float *)(prim + lVar32 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar63 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar64 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + lVar32 + 6));
  fVar121 = fVar122 * auVar64._0_4_;
  fVar104 = fVar122 * auVar63._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar29 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar29 * 5 + 6);
  auVar73 = vpmovsxbd_avx2(auVar44);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar29 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar59);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar29 * 0xf + 6);
  auVar87 = vpmovsxbd_avx2(auVar55);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar81 = vpmovsxbd_avx2(auVar58);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar76 = vcvtdq2ps_avx(auVar81);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar29 + 6);
  auVar77 = vpmovsxbd_avx2(auVar60);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar29 * 0x1a + 6);
  auVar78 = vpmovsxbd_avx2(auVar56);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar29 * 0x1b + 6);
  auVar79 = vpmovsxbd_avx2(auVar57);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar29 * 0x1c + 6);
  auVar72 = vpmovsxbd_avx2(auVar62);
  auVar80 = vcvtdq2ps_avx(auVar72);
  auVar89._4_4_ = fVar104;
  auVar89._0_4_ = fVar104;
  auVar89._8_4_ = fVar104;
  auVar89._12_4_ = fVar104;
  auVar89._16_4_ = fVar104;
  auVar89._20_4_ = fVar104;
  auVar89._24_4_ = fVar104;
  auVar89._28_4_ = fVar104;
  auVar244._8_4_ = 1;
  auVar244._0_8_ = 0x100000001;
  auVar244._12_4_ = 1;
  auVar244._16_4_ = 1;
  auVar244._20_4_ = 1;
  auVar244._24_4_ = 1;
  auVar244._28_4_ = 1;
  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = ZEXT1632(CONCAT412(fVar122 * auVar63._12_4_,
                               CONCAT48(fVar122 * auVar63._8_4_,
                                        CONCAT44(fVar122 * auVar63._4_4_,fVar104))));
  auVar82 = vpermps_avx2(auVar244,auVar83);
  auVar71 = vpermps_avx512vl(auVar70,auVar83);
  fVar213 = auVar71._0_4_;
  fVar199 = auVar71._4_4_;
  auVar83._4_4_ = fVar199 * auVar75._4_4_;
  auVar83._0_4_ = fVar213 * auVar75._0_4_;
  fVar208 = auVar71._8_4_;
  auVar83._8_4_ = fVar208 * auVar75._8_4_;
  fVar209 = auVar71._12_4_;
  auVar83._12_4_ = fVar209 * auVar75._12_4_;
  fVar111 = auVar71._16_4_;
  auVar83._16_4_ = fVar111 * auVar75._16_4_;
  fVar112 = auVar71._20_4_;
  auVar83._20_4_ = fVar112 * auVar75._20_4_;
  fVar113 = auVar71._24_4_;
  auVar83._24_4_ = fVar113 * auVar75._24_4_;
  auVar83._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar77._4_4_ * fVar199;
  auVar81._0_4_ = auVar77._0_4_ * fVar213;
  auVar81._8_4_ = auVar77._8_4_ * fVar208;
  auVar81._12_4_ = auVar77._12_4_ * fVar209;
  auVar81._16_4_ = auVar77._16_4_ * fVar111;
  auVar81._20_4_ = auVar77._20_4_ * fVar112;
  auVar81._24_4_ = auVar77._24_4_ * fVar113;
  auVar81._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar80._4_4_ * fVar199;
  auVar72._0_4_ = auVar80._0_4_ * fVar213;
  auVar72._8_4_ = auVar80._8_4_ * fVar208;
  auVar72._12_4_ = auVar80._12_4_ * fVar209;
  auVar72._16_4_ = auVar80._16_4_ * fVar111;
  auVar72._20_4_ = auVar80._20_4_ * fVar112;
  auVar72._24_4_ = auVar80._24_4_ * fVar113;
  auVar72._28_4_ = auVar71._28_4_;
  auVar43 = vfmadd231ps_fma(auVar83,auVar82,auVar73);
  auVar44 = vfmadd231ps_fma(auVar81,auVar82,auVar76);
  auVar59 = vfmadd231ps_fma(auVar72,auVar79,auVar82);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar89,auVar74);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar89,auVar87);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar78,auVar89);
  auVar235._4_4_ = fVar121;
  auVar235._0_4_ = fVar121;
  auVar235._8_4_ = fVar121;
  auVar235._12_4_ = fVar121;
  auVar235._16_4_ = fVar121;
  auVar235._20_4_ = fVar121;
  auVar235._24_4_ = fVar121;
  auVar235._28_4_ = fVar121;
  auVar72 = ZEXT1632(CONCAT412(fVar122 * auVar64._12_4_,
                               CONCAT48(fVar122 * auVar64._8_4_,
                                        CONCAT44(fVar122 * auVar64._4_4_,fVar121))));
  auVar81 = vpermps_avx2(auVar244,auVar72);
  auVar72 = vpermps_avx512vl(auVar70,auVar72);
  fVar122 = auVar72._0_4_;
  fVar213 = auVar72._4_4_;
  auVar82._4_4_ = fVar213 * auVar75._4_4_;
  auVar82._0_4_ = fVar122 * auVar75._0_4_;
  fVar199 = auVar72._8_4_;
  auVar82._8_4_ = fVar199 * auVar75._8_4_;
  fVar208 = auVar72._12_4_;
  auVar82._12_4_ = fVar208 * auVar75._12_4_;
  fVar209 = auVar72._16_4_;
  auVar82._16_4_ = fVar209 * auVar75._16_4_;
  fVar111 = auVar72._20_4_;
  auVar82._20_4_ = fVar111 * auVar75._20_4_;
  fVar112 = auVar72._24_4_;
  auVar82._24_4_ = fVar112 * auVar75._24_4_;
  auVar82._28_4_ = fVar104;
  auVar70._4_4_ = auVar77._4_4_ * fVar213;
  auVar70._0_4_ = auVar77._0_4_ * fVar122;
  auVar70._8_4_ = auVar77._8_4_ * fVar199;
  auVar70._12_4_ = auVar77._12_4_ * fVar208;
  auVar70._16_4_ = auVar77._16_4_ * fVar209;
  auVar70._20_4_ = auVar77._20_4_ * fVar111;
  auVar70._24_4_ = auVar77._24_4_ * fVar112;
  auVar70._28_4_ = auVar75._28_4_;
  auVar77._4_4_ = auVar80._4_4_ * fVar213;
  auVar77._0_4_ = auVar80._0_4_ * fVar122;
  auVar77._8_4_ = auVar80._8_4_ * fVar199;
  auVar77._12_4_ = auVar80._12_4_ * fVar208;
  auVar77._16_4_ = auVar80._16_4_ * fVar209;
  auVar77._20_4_ = auVar80._20_4_ * fVar111;
  auVar77._24_4_ = auVar80._24_4_ * fVar112;
  auVar77._28_4_ = auVar72._28_4_;
  auVar55 = vfmadd231ps_fma(auVar82,auVar81,auVar73);
  auVar58 = vfmadd231ps_fma(auVar70,auVar81,auVar76);
  auVar60 = vfmadd231ps_fma(auVar77,auVar81,auVar79);
  auVar63 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar235,auVar74);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar235,auVar87);
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar235,auVar78);
  auVar74 = vandps_avx(ZEXT1632(auVar43),auVar90);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  auVar178._16_4_ = 0x219392ef;
  auVar178._20_4_ = 0x219392ef;
  auVar178._24_4_ = 0x219392ef;
  auVar178._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar74,auVar178,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar71._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar44),auVar90);
  uVar36 = vcmpps_avx512vl(auVar74,auVar178,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar84._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar44._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar44._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar44._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar44._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar59),auVar90);
  uVar36 = vcmpps_avx512vl(auVar74,auVar178,1);
  bVar40 = (bool)((byte)uVar36 & 1);
  auVar74._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar59._0_4_;
  bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar59._4_4_;
  bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar59._8_4_;
  bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar59._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar145._8_4_ = 0x3f800000;
  auVar145._0_8_ = 0x3f8000003f800000;
  auVar145._12_4_ = 0x3f800000;
  auVar145._16_4_ = 0x3f800000;
  auVar145._20_4_ = 0x3f800000;
  auVar145._24_4_ = 0x3f800000;
  auVar145._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar71,auVar73,auVar145);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar84);
  auVar44 = vfnmadd213ps_fma(auVar84,auVar73,auVar145);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar74);
  auVar59 = vfnmadd213ps_fma(auVar74,auVar73,auVar145);
  auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar73,auVar73);
  fVar122 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar137._4_4_ = fVar122;
  auVar137._0_4_ = fVar122;
  auVar137._8_4_ = fVar122;
  auVar137._12_4_ = fVar122;
  auVar137._16_4_ = fVar122;
  auVar137._20_4_ = fVar122;
  auVar137._24_4_ = fVar122;
  auVar137._28_4_ = fVar122;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xb + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 9 + 6));
  auVar55 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar75);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xd + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar58 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x12 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar36 = (ulong)(uint)((int)(uVar29 * 5) << 2);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 2 + uVar36 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar60 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x18 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar56 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x1d + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + (ulong)(byte)PVar5 * 0x20 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar57 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar5 * 0x20 - uVar29) + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x23 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar62 = vfmadd213ps_fma(auVar73,auVar137,auVar74);
  auVar74 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar63));
  auVar78._4_4_ = auVar43._4_4_ * auVar74._4_4_;
  auVar78._0_4_ = auVar43._0_4_ * auVar74._0_4_;
  auVar78._8_4_ = auVar43._8_4_ * auVar74._8_4_;
  auVar78._12_4_ = auVar43._12_4_ * auVar74._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar63));
  auVar88._0_4_ = auVar43._0_4_ * auVar74._0_4_;
  auVar88._4_4_ = auVar43._4_4_ * auVar74._4_4_;
  auVar88._8_4_ = auVar43._8_4_ * auVar74._8_4_;
  auVar88._12_4_ = auVar43._12_4_ * auVar74._12_4_;
  auVar88._16_4_ = auVar74._16_4_ * 0.0;
  auVar88._20_4_ = auVar74._20_4_ * 0.0;
  auVar88._24_4_ = auVar74._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar74 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar64));
  auVar79._4_4_ = auVar44._4_4_ * auVar74._4_4_;
  auVar79._0_4_ = auVar44._0_4_ * auVar74._0_4_;
  auVar79._8_4_ = auVar44._8_4_ * auVar74._8_4_;
  auVar79._12_4_ = auVar44._12_4_ * auVar74._12_4_;
  auVar79._16_4_ = auVar74._16_4_ * 0.0;
  auVar79._20_4_ = auVar74._20_4_ * 0.0;
  auVar79._24_4_ = auVar74._24_4_ * 0.0;
  auVar79._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar64));
  auVar86._0_4_ = auVar44._0_4_ * auVar74._0_4_;
  auVar86._4_4_ = auVar44._4_4_ * auVar74._4_4_;
  auVar86._8_4_ = auVar44._8_4_ * auVar74._8_4_;
  auVar86._12_4_ = auVar44._12_4_ * auVar74._12_4_;
  auVar86._16_4_ = auVar74._16_4_ * 0.0;
  auVar86._20_4_ = auVar74._20_4_ * 0.0;
  auVar86._24_4_ = auVar74._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar74 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar106));
  auVar80._4_4_ = auVar59._4_4_ * auVar74._4_4_;
  auVar80._0_4_ = auVar59._0_4_ * auVar74._0_4_;
  auVar80._8_4_ = auVar59._8_4_ * auVar74._8_4_;
  auVar80._12_4_ = auVar59._12_4_ * auVar74._12_4_;
  auVar80._16_4_ = auVar74._16_4_ * 0.0;
  auVar80._20_4_ = auVar74._20_4_ * 0.0;
  auVar80._24_4_ = auVar74._24_4_ * 0.0;
  auVar80._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar106));
  auVar85._0_4_ = auVar59._0_4_ * auVar74._0_4_;
  auVar85._4_4_ = auVar59._4_4_ * auVar74._4_4_;
  auVar85._8_4_ = auVar59._8_4_ * auVar74._8_4_;
  auVar85._12_4_ = auVar59._12_4_ * auVar74._12_4_;
  auVar85._16_4_ = auVar74._16_4_ * 0.0;
  auVar85._20_4_ = auVar74._20_4_ * 0.0;
  auVar85._24_4_ = auVar74._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar78,auVar88);
  auVar73 = vpminsd_avx2(auVar79,auVar86);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73 = vpminsd_avx2(auVar80,auVar85);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar75._4_4_ = uVar105;
  auVar75._0_4_ = uVar105;
  auVar75._8_4_ = uVar105;
  auVar75._12_4_ = uVar105;
  auVar75._16_4_ = uVar105;
  auVar75._20_4_ = uVar105;
  auVar75._24_4_ = uVar105;
  auVar75._28_4_ = uVar105;
  auVar73 = vmaxps_avx512vl(auVar73,auVar75);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  auVar73._16_4_ = 0x3f7ffffa;
  auVar73._20_4_ = 0x3f7ffffa;
  auVar73._24_4_ = 0x3f7ffffa;
  auVar73._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar74,auVar73);
  auVar74 = vpmaxsd_avx2(auVar78,auVar88);
  auVar73 = vpmaxsd_avx2(auVar79,auVar86);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar73 = vpmaxsd_avx2(auVar80,auVar85);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar87._4_4_ = uVar105;
  auVar87._0_4_ = uVar105;
  auVar87._8_4_ = uVar105;
  auVar87._12_4_ = uVar105;
  auVar87._16_4_ = uVar105;
  auVar87._20_4_ = uVar105;
  auVar87._24_4_ = uVar105;
  auVar87._28_4_ = uVar105;
  auVar73 = vminps_avx512vl(auVar73,auVar87);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar76._8_4_ = 0x3f800003;
  auVar76._0_8_ = 0x3f8000033f800003;
  auVar76._12_4_ = 0x3f800003;
  auVar76._16_4_ = 0x3f800003;
  auVar76._20_4_ = 0x3f800003;
  auVar76._24_4_ = 0x3f800003;
  auVar76._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar76);
  auVar73 = vpbroadcastd_avx512vl();
  uVar14 = vpcmpgtd_avx512vl(auVar73,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_78,auVar74,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return;
  }
  uVar36 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_318 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar245 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar253 = ZEXT1664(auVar43);
  local_380 = prim;
LAB_01e1dba4:
  lVar32 = 0;
  for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar29 = (ulong)*(uint *)(local_380 + 2);
  pGVar7 = (context->scene->geometries).items[uVar29].ptr;
  fVar122 = (pGVar7->time_range).lower;
  fVar122 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar122) / ((pGVar7->time_range).upper - fVar122));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),9);
  uVar37 = *(uint *)(local_380 + lVar32 * 4 + 6);
  auVar44 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar43 = vminss_avx(auVar43,auVar44);
  auVar45 = vmaxss_avx512f(auVar245._0_16_,auVar43);
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar37 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar34 = (long)(int)auVar45._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar34);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar34);
  auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  lVar32 = uVar30 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar32);
  lVar1 = uVar30 + 2;
  auVar59 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar30 + 3;
  auVar55 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar34);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar34);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar34);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar34);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar63 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar64 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar106 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar34);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar34);
  auVar114 = *(undefined1 (*) [16])(lVar10 + uVar30 * lVar9);
  auVar65 = *(undefined1 (*) [16])(lVar10 + lVar32 * lVar9);
  auVar66 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar46 = vsubss_avx512f(ZEXT416((uint)fVar122),auVar45);
  auVar67._0_12_ = ZEXT812(0);
  auVar67._12_4_ = 0;
  auVar45 = vmulps_avx512vl(auVar55,auVar67);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar48 = vfmadd213ps_avx512vl(auVar47,auVar59,auVar45);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar44,auVar49);
  auVar50 = vfmadd231ps_avx512vl(auVar48,auVar43,auVar47);
  auVar68 = auVar253._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar59,auVar68);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar44,auVar67);
  auVar51 = vfnmadd231ps_avx512vl(auVar45,auVar43,auVar68);
  auVar53._0_4_ = auVar57._0_4_ * 0.0;
  auVar53._4_4_ = auVar57._4_4_ * 0.0;
  auVar53._8_4_ = auVar57._8_4_ * 0.0;
  auVar53._12_4_ = auVar57._12_4_ * 0.0;
  auVar45 = vfmadd213ps_avx512vl(auVar47,auVar56,auVar53);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar60,auVar49);
  auVar52 = vfmadd231ps_avx512vl(auVar45,auVar58,auVar47);
  auVar45 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar68);
  auVar45 = vfnmadd231ps_fma(auVar45,auVar60,auVar67);
  auVar53 = vfnmadd231ps_avx512vl(auVar45,auVar58,auVar68);
  auVar45 = vmulps_avx512vl(auVar55,auVar47);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar59,auVar49);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar44,auVar47);
  auVar54 = vfmadd231ps_avx512vl(auVar45,auVar43,auVar67);
  auVar55 = vmulps_avx512vl(auVar55,auVar68);
  auVar59 = vfmadd231ps_fma(auVar55,auVar67,auVar59);
  auVar44 = vfnmadd231ps_avx512vl(auVar59,auVar68,auVar44);
  auVar48 = vfnmadd231ps_fma(auVar44,auVar67,auVar43);
  auVar43 = vmulps_avx512vl(auVar57,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar56,auVar49);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar47);
  auVar45 = vfmadd231ps_fma(auVar43,auVar58,auVar67);
  auVar43 = vmulps_avx512vl(auVar57,auVar68);
  auVar43 = vfmadd231ps_fma(auVar43,auVar67,auVar56);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar68,auVar60);
  auVar60 = vfnmadd231ps_fma(auVar43,auVar67,auVar58);
  auVar44 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar43 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar43 = vmulps_avx512vl(auVar51,auVar43);
  auVar43 = vfmsub231ps_avx512vl(auVar43,auVar44,auVar52);
  auVar59 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar43 = vmulps_avx512vl(auVar51,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar44,auVar53);
  auVar55 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar44 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar69._0_4_ = auVar48._0_4_ * auVar44._0_4_;
  auVar69._4_4_ = auVar48._4_4_ * auVar44._4_4_;
  auVar69._8_4_ = auVar48._8_4_ * auVar44._8_4_;
  auVar69._12_4_ = auVar48._12_4_ * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar69,auVar43,auVar45);
  auVar58 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar149._0_4_ = auVar48._0_4_ * auVar44._0_4_;
  auVar149._4_4_ = auVar48._4_4_ * auVar44._4_4_;
  auVar149._8_4_ = auVar48._8_4_ * auVar44._8_4_;
  auVar149._12_4_ = auVar48._12_4_ * auVar44._12_4_;
  auVar43 = vfmsub231ps_fma(auVar149,auVar43,auVar60);
  auVar60 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar44 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar56 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar44);
  auVar44 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  fVar122 = auVar56._0_4_ + auVar44._0_4_;
  auVar167._4_4_ = fVar122;
  auVar167._0_4_ = fVar122;
  auVar167._8_4_ = fVar122;
  auVar167._12_4_ = fVar122;
  auVar44 = vdpps_avx(auVar59,auVar55,0x7f);
  auVar56 = vmulps_avx512vl(auVar59,auVar167);
  auVar57 = vbroadcastss_avx512vl(auVar43);
  auVar55 = vmulps_avx512vl(auVar57,auVar55);
  fVar104 = auVar44._0_4_;
  auVar61._0_4_ = fVar104 * auVar59._0_4_;
  auVar61._4_4_ = fVar104 * auVar59._4_4_;
  auVar61._8_4_ = fVar104 * auVar59._8_4_;
  auVar61._12_4_ = fVar104 * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar55,auVar61);
  auVar44 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar213 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar44 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar55 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar104 = auVar44._0_4_;
  fVar104 = auVar55._0_4_ + auVar57._0_4_ * fVar104 * fVar104 * fVar104;
  auVar168._0_4_ = auVar58._0_4_ * fVar104;
  auVar168._4_4_ = auVar58._4_4_ * fVar104;
  auVar168._8_4_ = auVar58._8_4_ * fVar104;
  auVar168._12_4_ = auVar58._12_4_ * fVar104;
  auVar44 = vdpps_avx(auVar58,auVar60,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar43);
  auVar55 = vmulps_avx512vl(auVar55,auVar60);
  fVar199 = auVar44._0_4_;
  auVar45._0_4_ = fVar199 * auVar58._0_4_;
  auVar45._4_4_ = fVar199 * auVar58._4_4_;
  auVar45._8_4_ = fVar199 * auVar58._8_4_;
  auVar45._12_4_ = fVar199 * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar55,auVar45);
  auVar55 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  fVar199 = auVar55._0_4_ * auVar43._0_4_;
  auVar43 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar55 = vmulps_avx512vl(auVar43,auVar56);
  auVar57 = vsubps_avx512vl(auVar50,auVar55);
  auVar58 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar58 = vmulps_avx512vl(auVar58,auVar56);
  auVar52._0_4_ = auVar58._0_4_ + auVar43._0_4_ * fVar122 * fVar213 * auVar59._0_4_;
  auVar52._4_4_ = auVar58._4_4_ + auVar43._4_4_ * fVar122 * fVar213 * auVar59._4_4_;
  auVar52._8_4_ = auVar58._8_4_ + auVar43._8_4_ * fVar122 * fVar213 * auVar59._8_4_;
  auVar52._12_4_ = auVar58._12_4_ + auVar43._12_4_ * fVar122 * fVar213 * auVar59._12_4_;
  auVar59 = vsubps_avx512vl(auVar51,auVar52);
  auVar45 = vaddps_avx512vl(auVar50,auVar55);
  auVar55 = vaddps_avx512vl(auVar51,auVar52);
  auVar43 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar58 = vmulps_avx512vl(auVar43,auVar168);
  auVar50 = vsubps_avx512vl(auVar54,auVar58);
  auVar60 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar60 = vmulps_avx512vl(auVar60,auVar168);
  auVar169._0_4_ = auVar60._0_4_ + auVar43._0_4_ * fVar104 * auVar44._0_4_ * fVar199;
  auVar169._4_4_ = auVar60._4_4_ + auVar43._4_4_ * fVar104 * auVar44._4_4_ * fVar199;
  auVar169._8_4_ = auVar60._8_4_ + auVar43._8_4_ * fVar104 * auVar44._8_4_ * fVar199;
  auVar169._12_4_ = auVar60._12_4_ + auVar43._12_4_ * fVar104 * auVar44._12_4_ * fVar199;
  auVar43 = vsubps_avx(auVar48,auVar169);
  auVar51 = vaddps_avx512vl(auVar54,auVar58);
  auVar44 = vaddps_avx512vl(auVar48,auVar169);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar59 = vmulps_avx512vl(auVar59,auVar48);
  auVar159._0_4_ = auVar57._0_4_ + auVar59._0_4_;
  auVar159._4_4_ = auVar57._4_4_ + auVar59._4_4_;
  auVar159._8_4_ = auVar57._8_4_ + auVar59._8_4_;
  auVar159._12_4_ = auVar57._12_4_ + auVar59._12_4_;
  auVar43 = vmulps_avx512vl(auVar43,auVar48);
  auVar56 = vsubps_avx(auVar50,auVar43);
  auVar43 = vmulps_avx512vl(auVar55,auVar48);
  local_3a8._4_4_ = auVar45._4_4_ + auVar43._4_4_;
  local_3a8._0_4_ = auVar45._0_4_ + auVar43._0_4_;
  fStack_3a0 = auVar45._8_4_ + auVar43._8_4_;
  fStack_39c = auVar45._12_4_ + auVar43._12_4_;
  auVar43 = vmulps_avx512vl(auVar44,auVar48);
  auVar52 = vsubps_avx512vl(auVar51,auVar43);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar44 = vmulps_avx512vl(auVar106,auVar67);
  auVar59 = vfmadd213ps_avx512vl(auVar47,auVar64,auVar44);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar49);
  auVar53 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar64,auVar68);
  auVar44 = vfnmadd231ps_fma(auVar44,auVar63,auVar67);
  auVar54 = vfnmadd231ps_avx512vl(auVar44,auVar62,auVar68);
  auVar44 = vmulps_avx512vl(auVar43,auVar67);
  auVar59 = vfmadd213ps_avx512vl(auVar47,auVar66,auVar44);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar65,auVar49);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar114,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar66,auVar68);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar65,auVar67);
  auVar55 = vfnmadd231ps_avx512vl(auVar44,auVar114,auVar68);
  auVar44 = vmulps_avx512vl(auVar106,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar64,auVar49);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar47);
  auVar61 = vfmadd231ps_avx512vl(auVar44,auVar62,auVar67);
  auVar44 = vmulps_avx512vl(auVar106,auVar68);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar67,auVar64);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar68,auVar63);
  auVar62 = vfnmadd231ps_avx512vl(auVar44,auVar67,auVar62);
  auVar44 = vmulps_avx512vl(auVar43,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar66,auVar49);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar65,auVar47);
  auVar44 = vfmadd231ps_fma(auVar44,auVar114,auVar67);
  auVar43 = vmulps_avx512vl(auVar43,auVar68);
  auVar43 = vfmadd231ps_fma(auVar43,auVar67,auVar66);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar68,auVar65);
  auVar60 = vfnmadd231ps_fma(auVar43,auVar67,auVar114);
  auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar58 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  fVar199 = auVar54._0_4_;
  auVar214._0_4_ = fVar199 * auVar58._0_4_;
  fVar208 = auVar54._4_4_;
  auVar214._4_4_ = fVar208 * auVar58._4_4_;
  fVar209 = auVar54._8_4_;
  auVar214._8_4_ = fVar209 * auVar58._8_4_;
  fVar111 = auVar54._12_4_;
  auVar214._12_4_ = fVar111 * auVar58._12_4_;
  auVar59 = vfmsub231ps_avx512vl(auVar214,auVar43,auVar59);
  auVar59 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar58 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar223._0_4_ = fVar199 * auVar58._0_4_;
  auVar223._4_4_ = fVar208 * auVar58._4_4_;
  auVar223._8_4_ = fVar209 * auVar58._8_4_;
  auVar223._12_4_ = fVar111 * auVar58._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar223,auVar43,auVar55);
  auVar55 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar63 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar43 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar43 = vmulps_avx512vl(auVar62,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar63,auVar44);
  auVar58 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar44 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar43 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar44 = vmulps_avx512vl(auVar62,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar63,auVar60);
  auVar60 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar63 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar64 = vmulss_avx512f(auVar64,auVar44);
  auVar44 = vmulss_avx512f(auVar64,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vaddss_avx512f(auVar63,auVar44);
  auVar237._0_4_ = auVar44._0_4_;
  auVar237._4_4_ = auVar237._0_4_;
  auVar237._8_4_ = auVar237._0_4_;
  auVar237._12_4_ = auVar237._0_4_;
  auVar63 = vmulps_avx512vl(auVar59,auVar237);
  auVar44 = vdpps_avx(auVar59,auVar55,0x7f);
  auVar64 = vbroadcastss_avx512vl(auVar43);
  auVar55 = vmulps_avx512vl(auVar64,auVar55);
  fVar122 = auVar44._0_4_;
  auVar65._0_4_ = auVar59._0_4_ * fVar122;
  auVar65._4_4_ = auVar59._4_4_ * fVar122;
  auVar65._8_4_ = auVar59._8_4_ * fVar122;
  auVar65._12_4_ = auVar59._12_4_ * fVar122;
  auVar59 = vsubps_avx(auVar55,auVar65);
  auVar44 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar104 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar44 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar55 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar122 = auVar44._0_4_;
  fVar122 = auVar55._0_4_ + auVar64._0_4_ * fVar122 * fVar122 * fVar122;
  auVar231._0_4_ = auVar58._0_4_ * fVar122;
  auVar231._4_4_ = auVar58._4_4_ * fVar122;
  auVar231._8_4_ = auVar58._8_4_ * fVar122;
  auVar231._12_4_ = auVar58._12_4_ * fVar122;
  auVar44 = vdpps_avx(auVar58,auVar60,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar43);
  auVar55 = vmulps_avx512vl(auVar55,auVar60);
  fVar213 = auVar44._0_4_;
  auVar189._0_4_ = fVar213 * auVar58._0_4_;
  auVar189._4_4_ = fVar213 * auVar58._4_4_;
  auVar189._8_4_ = fVar213 * auVar58._8_4_;
  auVar189._12_4_ = fVar213 * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar55,auVar189);
  auVar55 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar43._0_4_));
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  auVar250 = ZEXT464(0x3f800000);
  fVar213 = auVar43._0_4_ * auVar55._0_4_;
  auVar55 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar58 = vmulps_avx512vl(auVar55,auVar63);
  auVar60 = vsubps_avx512vl(auVar53,auVar58);
  auVar43 = vshufps_avx(auVar54,auVar54,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar63);
  auVar49._0_4_ = auVar43._0_4_ + auVar55._0_4_ * auVar237._0_4_ * fVar104 * auVar59._0_4_;
  auVar49._4_4_ = auVar43._4_4_ + auVar55._4_4_ * auVar237._0_4_ * fVar104 * auVar59._4_4_;
  auVar49._8_4_ = auVar43._8_4_ + auVar55._8_4_ * auVar237._0_4_ * fVar104 * auVar59._8_4_;
  auVar49._12_4_ = auVar43._12_4_ + auVar55._12_4_ * auVar237._0_4_ * fVar104 * auVar59._12_4_;
  auVar43 = vsubps_avx(auVar54,auVar49);
  auVar59 = vaddps_avx512vl(auVar53,auVar58);
  auVar54._0_4_ = fVar199 + auVar49._0_4_;
  auVar54._4_4_ = fVar208 + auVar49._4_4_;
  auVar54._8_4_ = fVar209 + auVar49._8_4_;
  auVar54._12_4_ = fVar111 + auVar49._12_4_;
  auVar55 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar224._0_4_ = auVar55._0_4_ * auVar231._0_4_;
  auVar224._4_4_ = auVar55._4_4_ * auVar231._4_4_;
  auVar224._8_4_ = auVar55._8_4_ * auVar231._8_4_;
  auVar224._12_4_ = auVar55._12_4_ * auVar231._12_4_;
  auVar58 = vsubps_avx512vl(auVar61,auVar224);
  auVar63 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar63 = vmulps_avx512vl(auVar63,auVar231);
  auVar150._0_4_ = auVar63._0_4_ + auVar55._0_4_ * fVar122 * auVar44._0_4_ * fVar213;
  auVar150._4_4_ = auVar63._4_4_ + auVar55._4_4_ * fVar122 * auVar44._4_4_ * fVar213;
  auVar150._8_4_ = auVar63._8_4_ + auVar55._8_4_ * fVar122 * auVar44._8_4_ * fVar213;
  auVar150._12_4_ = auVar63._12_4_ + auVar55._12_4_ * fVar122 * auVar44._12_4_ * fVar213;
  auVar44 = vsubps_avx512vl(auVar62,auVar150);
  auVar55 = vaddps_avx512vl(auVar61,auVar224);
  auVar62 = vaddps_avx512vl(auVar62,auVar150);
  auVar43 = vmulps_avx512vl(auVar43,auVar48);
  auVar190._0_4_ = auVar60._0_4_ + auVar43._0_4_;
  auVar190._4_4_ = auVar60._4_4_ + auVar43._4_4_;
  auVar190._8_4_ = auVar60._8_4_ + auVar43._8_4_;
  auVar190._12_4_ = auVar60._12_4_ + auVar43._12_4_;
  auVar43 = vmulps_avx512vl(auVar44,auVar48);
  auVar43 = vsubps_avx(auVar58,auVar43);
  auVar44 = vmulps_avx512vl(auVar54,auVar48);
  auVar68._0_4_ = auVar59._0_4_ + auVar44._0_4_;
  auVar68._4_4_ = auVar59._4_4_ + auVar44._4_4_;
  auVar68._8_4_ = auVar59._8_4_ + auVar44._8_4_;
  auVar68._12_4_ = auVar59._12_4_ + auVar44._12_4_;
  auVar44 = vmulps_avx512vl(auVar62,auVar48);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar251 = ZEXT1664(auVar63);
  auVar44 = vsubps_avx(auVar55,auVar44);
  auVar62 = vbroadcastss_avx512vl(auVar46);
  auVar64 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
  auVar106._0_4_ = auVar64._0_4_;
  auVar106._4_4_ = auVar106._0_4_;
  auVar106._8_4_ = auVar106._0_4_;
  auVar106._12_4_ = auVar106._0_4_;
  auVar60 = vmulps_avx512vl(auVar62,auVar60);
  auVar64 = vmulps_avx512vl(auVar62,auVar190);
  auVar43 = vmulps_avx512vl(auVar62,auVar43);
  auVar238._0_4_ = auVar62._0_4_ * auVar58._0_4_;
  auVar238._4_4_ = auVar62._4_4_ * auVar58._4_4_;
  auVar238._8_4_ = auVar62._8_4_ * auVar58._8_4_;
  auVar238._12_4_ = auVar62._12_4_ * auVar58._12_4_;
  local_238 = vfmadd231ps_avx512vl(auVar60,auVar106,auVar57);
  local_248 = vfmadd231ps_avx512vl(auVar64,auVar106,auVar159);
  local_258 = vfmadd231ps_avx512vl(auVar43,auVar106,auVar56);
  local_268 = vfmadd231ps_fma(auVar238,auVar106,auVar50);
  auVar43 = vmulps_avx512vl(auVar62,auVar59);
  auVar59 = vmulps_avx512vl(auVar62,auVar68);
  auVar44 = vmulps_avx512vl(auVar62,auVar44);
  auVar225._0_4_ = auVar62._0_4_ * auVar55._0_4_;
  auVar225._4_4_ = auVar62._4_4_ * auVar55._4_4_;
  auVar225._8_4_ = auVar62._8_4_ * auVar55._8_4_;
  auVar225._12_4_ = auVar62._12_4_ * auVar55._12_4_;
  _local_278 = vfmadd231ps_avx512vl(auVar43,auVar106,auVar45);
  _local_288 = vfmadd231ps_avx512vl(auVar59,auVar106,_local_3a8);
  _local_298 = vfmadd231ps_avx512vl(auVar44,auVar106,auVar52);
  _local_2a8 = vfmadd231ps_fma(auVar225,auVar106,auVar51);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar122 = *(float *)(ray + k * 4 + 0x30);
  local_1b8 = vsubps_avx512vl(local_238,auVar43);
  uVar105 = local_1b8._0_4_;
  auVar114._4_4_ = uVar105;
  auVar114._0_4_ = uVar105;
  auVar114._8_4_ = uVar105;
  auVar114._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar59 = vshufps_avx(local_1b8,local_1b8,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar104 = pre->ray_space[k].vz.field_0.m128[0];
  fVar213 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar208 = pre->ray_space[k].vz.field_0.m128[3];
  auVar64._0_4_ = fVar104 * auVar59._0_4_;
  auVar64._4_4_ = fVar213 * auVar59._4_4_;
  auVar64._8_4_ = fVar199 * auVar59._8_4_;
  auVar64._12_4_ = fVar208 * auVar59._12_4_;
  auVar44 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar4,auVar44);
  auVar58 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar114);
  local_1c8 = vsubps_avx512vl(local_248,auVar43);
  uVar105 = local_1c8._0_4_;
  auVar48._4_4_ = uVar105;
  auVar48._0_4_ = uVar105;
  auVar48._8_4_ = uVar105;
  auVar48._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar59 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar66._0_4_ = fVar104 * auVar59._0_4_;
  auVar66._4_4_ = fVar213 * auVar59._4_4_;
  auVar66._8_4_ = fVar199 * auVar59._8_4_;
  auVar66._12_4_ = fVar208 * auVar59._12_4_;
  auVar44 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar44);
  auVar60 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar48);
  local_1d8 = vsubps_avx512vl(local_258,auVar43);
  uVar105 = local_1d8._0_4_;
  auVar50._4_4_ = uVar105;
  auVar50._0_4_ = uVar105;
  auVar50._8_4_ = uVar105;
  auVar50._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar59 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar46._0_4_ = fVar104 * auVar59._0_4_;
  auVar46._4_4_ = fVar213 * auVar59._4_4_;
  auVar46._8_4_ = fVar199 * auVar59._8_4_;
  auVar46._12_4_ = fVar208 * auVar59._12_4_;
  auVar44 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar4,auVar44);
  auVar56 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar50);
  local_1e8 = vsubps_avx(local_268,auVar43);
  uVar105 = local_1e8._0_4_;
  auVar170._4_4_ = uVar105;
  auVar170._0_4_ = uVar105;
  auVar170._8_4_ = uVar105;
  auVar170._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar59 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar51._0_4_ = fVar104 * auVar59._0_4_;
  auVar51._4_4_ = fVar213 * auVar59._4_4_;
  auVar51._8_4_ = fVar199 * auVar59._8_4_;
  auVar51._12_4_ = fVar208 * auVar59._12_4_;
  auVar44 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar44);
  auVar57 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar170);
  local_1f8 = vsubps_avx512vl(_local_278,auVar43);
  uVar105 = local_1f8._0_4_;
  auVar171._4_4_ = uVar105;
  auVar171._0_4_ = uVar105;
  auVar171._8_4_ = uVar105;
  auVar171._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar59 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar191._0_4_ = auVar59._0_4_ * fVar104;
  auVar191._4_4_ = auVar59._4_4_ * fVar213;
  auVar191._8_4_ = auVar59._8_4_ * fVar199;
  auVar191._12_4_ = auVar59._12_4_ * fVar208;
  auVar44 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar4,auVar44);
  auVar62 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar171);
  local_208 = vsubps_avx512vl(_local_288,auVar43);
  uVar105 = local_208._0_4_;
  auVar172._4_4_ = uVar105;
  auVar172._0_4_ = uVar105;
  auVar172._8_4_ = uVar105;
  auVar172._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_208,local_208,0x55);
  auVar59 = vshufps_avx(local_208,local_208,0xaa);
  auVar200._0_4_ = auVar59._0_4_ * fVar104;
  auVar200._4_4_ = auVar59._4_4_ * fVar213;
  auVar200._8_4_ = auVar59._8_4_ * fVar199;
  auVar200._12_4_ = auVar59._12_4_ * fVar208;
  auVar44 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar4,auVar44);
  auVar64 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar172);
  local_218 = vsubps_avx512vl(_local_298,auVar43);
  uVar105 = local_218._0_4_;
  auVar173._4_4_ = uVar105;
  auVar173._0_4_ = uVar105;
  auVar173._8_4_ = uVar105;
  auVar173._12_4_ = uVar105;
  auVar44 = vshufps_avx(local_218,local_218,0x55);
  auVar59 = vshufps_avx(local_218,local_218,0xaa);
  auVar215._0_4_ = auVar59._0_4_ * fVar104;
  auVar215._4_4_ = auVar59._4_4_ * fVar213;
  auVar215._8_4_ = auVar59._8_4_ * fVar199;
  auVar215._12_4_ = auVar59._12_4_ * fVar208;
  auVar44 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar4,auVar44);
  auVar106 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar173);
  local_228 = vsubps_avx(_local_2a8,auVar43);
  uVar105 = local_228._0_4_;
  auVar47._4_4_ = uVar105;
  auVar47._0_4_ = uVar105;
  auVar47._8_4_ = uVar105;
  auVar47._12_4_ = uVar105;
  auVar43 = vshufps_avx(local_228,local_228,0x55);
  auVar44 = vshufps_avx(local_228,local_228,0xaa);
  auVar160._0_4_ = auVar44._0_4_ * fVar104;
  auVar160._4_4_ = auVar44._4_4_ * fVar213;
  auVar160._8_4_ = auVar44._8_4_ * fVar199;
  auVar160._12_4_ = auVar44._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar4,auVar43);
  auVar114 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar3,auVar47);
  auVar59 = vmovlhps_avx(auVar58,auVar62);
  local_338 = vmovlhps_avx(auVar60,auVar64);
  local_348 = vmovlhps_avx(auVar56,auVar106);
  _local_178 = vmovlhps_avx512f(auVar57,auVar114);
  auVar44 = vminps_avx(auVar59,local_338);
  auVar43 = vmaxps_avx(auVar59,local_338);
  auVar55 = vminps_avx512vl(local_348,_local_178);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vmaxps_avx512vl(local_348,_local_178);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar55 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar44 = vandps_avx512vl(auVar44,auVar63);
  auVar43 = vandps_avx512vl(auVar43,auVar63);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  fVar104 = auVar43._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar58);
  auVar55 = vmovddup_avx512vl(auVar60);
  auVar58 = vmovddup_avx512vl(auVar56);
  auVar60 = vmovddup_avx512vl(auVar57);
  local_148 = vbroadcastss_avx512vl(ZEXT416((uint)fVar104));
  auVar43 = vxorps_avx512vl(local_148._0_16_,auVar65);
  local_168 = vbroadcastss_avx512vl(auVar43);
  uVar30 = 0;
  local_188 = vsubps_avx(local_338,auVar59);
  local_198 = vsubps_avx(local_348,local_338);
  local_1a8 = vsubps_avx512vl(_local_178,local_348);
  local_2b8 = vsubps_avx512vl(_local_278,local_238);
  local_2c8 = vsubps_avx512vl(_local_288,local_248);
  local_2d8 = vsubps_avx512vl(_local_298,local_258);
  _local_2e8 = vsubps_avx(_local_2a8,local_268);
  local_2f8 = vpbroadcastd_avx512vl();
  local_308 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar63 = auVar43;
LAB_01e1e6ef:
  do {
    auVar56 = vshufps_avx(auVar63,auVar63,0x50);
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar236._16_4_ = 0x3f800000;
    auVar236._0_16_ = auVar232;
    auVar236._20_4_ = 0x3f800000;
    auVar236._24_4_ = 0x3f800000;
    auVar236._28_4_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar232,auVar56);
    fVar213 = auVar56._0_4_;
    fVar111 = auVar62._0_4_;
    auVar133._0_4_ = fVar111 * fVar213;
    fVar199 = auVar56._4_4_;
    fVar112 = auVar62._4_4_;
    auVar133._4_4_ = fVar112 * fVar199;
    fVar208 = auVar56._8_4_;
    auVar133._8_4_ = fVar111 * fVar208;
    fVar209 = auVar56._12_4_;
    auVar133._12_4_ = fVar112 * fVar209;
    fVar113 = auVar64._0_4_;
    auVar139._0_4_ = fVar113 * fVar213;
    fVar121 = auVar64._4_4_;
    auVar139._4_4_ = fVar121 * fVar199;
    auVar139._8_4_ = fVar113 * fVar208;
    auVar139._12_4_ = fVar121 * fVar209;
    fVar148 = auVar106._0_4_;
    auVar151._0_4_ = fVar148 * fVar213;
    fVar157 = auVar106._4_4_;
    auVar151._4_4_ = fVar157 * fVar199;
    auVar151._8_4_ = fVar148 * fVar208;
    auVar151._12_4_ = fVar157 * fVar209;
    fVar158 = auVar114._0_4_;
    auVar116._0_4_ = fVar158 * fVar213;
    fVar166 = auVar114._4_4_;
    auVar116._4_4_ = fVar166 * fVar199;
    auVar116._8_4_ = fVar158 * fVar208;
    auVar116._12_4_ = fVar166 * fVar209;
    auVar65 = vfmadd231ps_avx512vl(auVar133,auVar57,auVar44);
    auVar66 = vfmadd231ps_avx512vl(auVar139,auVar57,auVar55);
    auVar45 = vfmadd231ps_avx512vl(auVar151,auVar57,auVar58);
    auVar57 = vfmadd231ps_avx512vl(auVar116,auVar60,auVar57);
    auVar56 = vmovshdup_avx(auVar43);
    fVar199 = auVar43._0_4_;
    fVar213 = (auVar56._0_4_ - fVar199) * 0.04761905;
    auVar179._4_4_ = fVar199;
    auVar179._0_4_ = fVar199;
    auVar179._8_4_ = fVar199;
    auVar179._12_4_ = fVar199;
    auVar179._16_4_ = fVar199;
    auVar179._20_4_ = fVar199;
    auVar179._24_4_ = fVar199;
    auVar179._28_4_ = fVar199;
    auVar128._0_8_ = auVar56._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar74 = vsubps_avx(auVar128,auVar179);
    uVar105 = auVar65._0_4_;
    auVar129._4_4_ = uVar105;
    auVar129._0_4_ = uVar105;
    auVar129._8_4_ = uVar105;
    auVar129._12_4_ = uVar105;
    auVar129._16_4_ = uVar105;
    auVar129._20_4_ = uVar105;
    auVar129._24_4_ = uVar105;
    auVar129._28_4_ = uVar105;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar87 = ZEXT1632(auVar65);
    auVar73 = vpermps_avx2(auVar196,auVar87);
    auVar75 = vbroadcastss_avx512vl(auVar66);
    auVar70 = ZEXT1632(auVar66);
    auVar76 = vpermps_avx512vl(auVar196,auVar70);
    auVar77 = vbroadcastss_avx512vl(auVar45);
    auVar71 = ZEXT1632(auVar45);
    auVar78 = vpermps_avx512vl(auVar196,auVar71);
    auVar79 = vbroadcastss_avx512vl(auVar57);
    auVar85 = ZEXT1632(auVar57);
    auVar80 = vpermps_avx512vl(auVar196,auVar85);
    auVar197._4_4_ = fVar213;
    auVar197._0_4_ = fVar213;
    auVar197._8_4_ = fVar213;
    auVar197._12_4_ = fVar213;
    auVar197._16_4_ = fVar213;
    auVar197._20_4_ = fVar213;
    auVar197._24_4_ = fVar213;
    auVar197._28_4_ = fVar213;
    auVar165._8_4_ = 2;
    auVar165._0_8_ = 0x200000002;
    auVar165._12_4_ = 2;
    auVar165._16_4_ = 2;
    auVar165._20_4_ = 2;
    auVar165._24_4_ = 2;
    auVar165._28_4_ = 2;
    auVar81 = vpermps_avx512vl(auVar165,auVar87);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar82 = vpermps_avx512vl(auVar72,auVar87);
    auVar83 = vpermps_avx512vl(auVar165,auVar70);
    auVar70 = vpermps_avx512vl(auVar72,auVar70);
    auVar87 = vpermps_avx2(auVar165,auVar71);
    auVar71 = vpermps_avx512vl(auVar72,auVar71);
    auVar84 = vpermps_avx512vl(auVar165,auVar85);
    auVar72 = vpermps_avx512vl(auVar72,auVar85);
    auVar56 = vfmadd132ps_fma(auVar74,auVar179,_DAT_01faff20);
    auVar74 = vsubps_avx(auVar236,ZEXT1632(auVar56));
    auVar85 = vmulps_avx512vl(auVar75,ZEXT1632(auVar56));
    auVar88 = ZEXT1632(auVar56);
    auVar86 = vmulps_avx512vl(auVar76,auVar88);
    auVar57 = vfmadd231ps_fma(auVar85,auVar74,auVar129);
    auVar65 = vfmadd231ps_fma(auVar86,auVar74,auVar73);
    auVar85 = vmulps_avx512vl(auVar77,auVar88);
    auVar86 = vmulps_avx512vl(auVar78,auVar88);
    auVar75 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar86,auVar74,auVar76);
    auVar85 = vmulps_avx512vl(auVar79,auVar88);
    auVar86 = ZEXT1632(auVar56);
    auVar80 = vmulps_avx512vl(auVar80,auVar86);
    auVar77 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar78);
    fVar208 = auVar56._0_4_;
    fVar209 = auVar56._4_4_;
    auVar19._4_4_ = fVar209 * auVar75._4_4_;
    auVar19._0_4_ = fVar208 * auVar75._0_4_;
    fVar210 = auVar56._8_4_;
    auVar19._8_4_ = fVar210 * auVar75._8_4_;
    fVar211 = auVar56._12_4_;
    auVar19._12_4_ = fVar211 * auVar75._12_4_;
    auVar19._16_4_ = auVar75._16_4_ * 0.0;
    auVar19._20_4_ = auVar75._20_4_ * 0.0;
    auVar19._24_4_ = auVar75._24_4_ * 0.0;
    auVar19._28_4_ = fVar199;
    auVar20._4_4_ = fVar209 * auVar76._4_4_;
    auVar20._0_4_ = fVar208 * auVar76._0_4_;
    auVar20._8_4_ = fVar210 * auVar76._8_4_;
    auVar20._12_4_ = fVar211 * auVar76._12_4_;
    auVar20._16_4_ = auVar76._16_4_ * 0.0;
    auVar20._20_4_ = auVar76._20_4_ * 0.0;
    auVar20._24_4_ = auVar76._24_4_ * 0.0;
    auVar20._28_4_ = auVar73._28_4_;
    auVar57 = vfmadd231ps_fma(auVar19,auVar74,ZEXT1632(auVar57));
    auVar65 = vfmadd231ps_fma(auVar20,auVar74,ZEXT1632(auVar65));
    auVar119._0_4_ = fVar208 * auVar77._0_4_;
    auVar119._4_4_ = fVar209 * auVar77._4_4_;
    auVar119._8_4_ = fVar210 * auVar77._8_4_;
    auVar119._12_4_ = fVar211 * auVar77._12_4_;
    auVar119._16_4_ = auVar77._16_4_ * 0.0;
    auVar119._20_4_ = auVar77._20_4_ * 0.0;
    auVar119._24_4_ = auVar77._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar21._4_4_ = fVar209 * auVar78._4_4_;
    auVar21._0_4_ = fVar208 * auVar78._0_4_;
    auVar21._8_4_ = fVar210 * auVar78._8_4_;
    auVar21._12_4_ = fVar211 * auVar78._12_4_;
    auVar21._16_4_ = auVar78._16_4_ * 0.0;
    auVar21._20_4_ = auVar78._20_4_ * 0.0;
    auVar21._24_4_ = auVar78._24_4_ * 0.0;
    auVar21._28_4_ = auVar77._28_4_;
    auVar66 = vfmadd231ps_fma(auVar119,auVar74,auVar75);
    auVar45 = vfmadd231ps_fma(auVar21,auVar74,auVar76);
    auVar22._28_4_ = auVar76._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar45._12_4_,
                            CONCAT48(fVar210 * auVar45._8_4_,
                                     CONCAT44(fVar209 * auVar45._4_4_,fVar208 * auVar45._0_4_))));
    auVar48 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar66._12_4_,
                                                 CONCAT48(fVar210 * auVar66._8_4_,
                                                          CONCAT44(fVar209 * auVar66._4_4_,
                                                                   fVar208 * auVar66._0_4_)))),
                              auVar74,ZEXT1632(auVar57));
    auVar46 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar65));
    auVar73 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar57));
    auVar75 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar65));
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar73 = vmulps_avx512vl(auVar73,auVar76);
    auVar75 = vmulps_avx512vl(auVar75,auVar76);
    auVar188._0_4_ = fVar213 * auVar73._0_4_;
    auVar188._4_4_ = fVar213 * auVar73._4_4_;
    auVar188._8_4_ = fVar213 * auVar73._8_4_;
    auVar188._12_4_ = fVar213 * auVar73._12_4_;
    auVar188._16_4_ = fVar213 * auVar73._16_4_;
    auVar188._20_4_ = fVar213 * auVar73._20_4_;
    auVar188._24_4_ = fVar213 * auVar73._24_4_;
    auVar188._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar197,auVar75);
    auVar65 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_01feed00,ZEXT1632(auVar65));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01feed00,ZEXT1632(auVar65));
    auVar120._0_4_ = auVar188._0_4_ + auVar48._0_4_;
    auVar120._4_4_ = auVar188._4_4_ + auVar48._4_4_;
    auVar120._8_4_ = auVar188._8_4_ + auVar48._8_4_;
    auVar120._12_4_ = auVar188._12_4_ + auVar48._12_4_;
    auVar120._16_4_ = auVar188._16_4_ + 0.0;
    auVar120._20_4_ = auVar188._20_4_ + 0.0;
    auVar120._24_4_ = auVar188._24_4_ + 0.0;
    auVar120._28_4_ = 0;
    auVar88 = ZEXT1632(auVar65);
    auVar78 = vpermt2ps_avx512vl(auVar188,_DAT_01feed00,auVar88);
    auVar79 = vaddps_avx512vl(ZEXT1632(auVar46),auVar73);
    auVar80 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar88);
    auVar73 = vsubps_avx(auVar75,auVar78);
    auVar78 = vsubps_avx512vl(auVar77,auVar80);
    auVar80 = vmulps_avx512vl(auVar83,auVar86);
    auVar85 = vmulps_avx512vl(auVar70,auVar86);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar81);
    auVar81 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar82);
    auVar82 = vmulps_avx512vl(auVar87,auVar86);
    auVar85 = vmulps_avx512vl(auVar71,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar83);
    auVar83 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar70);
    auVar70 = vmulps_avx512vl(auVar84,auVar86);
    auVar72 = vmulps_avx512vl(auVar72,auVar86);
    auVar57 = vfmadd231ps_fma(auVar70,auVar74,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar72,auVar74,auVar71);
    auVar72 = vmulps_avx512vl(auVar86,auVar82);
    auVar84 = ZEXT1632(auVar56);
    auVar70 = vmulps_avx512vl(auVar84,auVar83);
    auVar80 = vfmadd231ps_avx512vl(auVar72,auVar74,auVar80);
    auVar81 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar81);
    auVar87 = vmulps_avx512vl(auVar84,auVar87);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar57._12_4_,
                                            CONCAT48(fVar210 * auVar57._8_4_,
                                                     CONCAT44(fVar209 * auVar57._4_4_,
                                                              fVar208 * auVar57._0_4_)))),auVar74,
                         auVar82);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar74,auVar83);
    auVar23._4_4_ = fVar209 * auVar72._4_4_;
    auVar23._0_4_ = fVar208 * auVar72._0_4_;
    auVar23._8_4_ = fVar210 * auVar72._8_4_;
    auVar23._12_4_ = fVar211 * auVar72._12_4_;
    auVar23._16_4_ = auVar72._16_4_ * 0.0;
    auVar23._20_4_ = auVar72._20_4_ * 0.0;
    auVar23._24_4_ = auVar72._24_4_ * 0.0;
    auVar23._28_4_ = auVar71._28_4_;
    auVar82 = vmulps_avx512vl(auVar84,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar23,auVar74,auVar80);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar74);
    auVar74 = vsubps_avx512vl(auVar72,auVar80);
    auVar87 = vsubps_avx512vl(auVar87,auVar81);
    auVar74 = vmulps_avx512vl(auVar74,auVar76);
    auVar87 = vmulps_avx512vl(auVar87,auVar76);
    fVar199 = fVar213 * auVar74._0_4_;
    fVar208 = fVar213 * auVar74._4_4_;
    auVar24._4_4_ = fVar208;
    auVar24._0_4_ = fVar199;
    fVar209 = fVar213 * auVar74._8_4_;
    auVar24._8_4_ = fVar209;
    fVar210 = fVar213 * auVar74._12_4_;
    auVar24._12_4_ = fVar210;
    fVar211 = fVar213 * auVar74._16_4_;
    auVar24._16_4_ = fVar211;
    fVar212 = fVar213 * auVar74._20_4_;
    auVar24._20_4_ = fVar212;
    fVar213 = fVar213 * auVar74._24_4_;
    auVar24._24_4_ = fVar213;
    auVar24._28_4_ = auVar74._28_4_;
    auVar87 = vmulps_avx512vl(auVar197,auVar87);
    auVar76 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar88);
    auVar80 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar88);
    auVar198._0_4_ = auVar83._0_4_ + fVar199;
    auVar198._4_4_ = auVar83._4_4_ + fVar208;
    auVar198._8_4_ = auVar83._8_4_ + fVar209;
    auVar198._12_4_ = auVar83._12_4_ + fVar210;
    auVar198._16_4_ = auVar83._16_4_ + fVar211;
    auVar198._20_4_ = auVar83._20_4_ + fVar212;
    auVar198._24_4_ = auVar83._24_4_ + fVar213;
    auVar198._28_4_ = auVar83._28_4_ + auVar74._28_4_;
    auVar74 = vpermt2ps_avx512vl(auVar24,_DAT_01feed00,ZEXT1632(auVar65));
    auVar81 = vaddps_avx512vl(auVar82,auVar87);
    auVar87 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar65));
    auVar74 = vsubps_avx(auVar76,auVar74);
    auVar87 = vsubps_avx512vl(auVar80,auVar87);
    auVar137 = ZEXT1632(auVar48);
    auVar72 = vsubps_avx512vl(auVar83,auVar137);
    auVar145 = ZEXT1632(auVar46);
    auVar70 = vsubps_avx512vl(auVar82,auVar145);
    auVar71 = vsubps_avx512vl(auVar76,auVar75);
    auVar72 = vaddps_avx512vl(auVar72,auVar71);
    auVar71 = vsubps_avx512vl(auVar80,auVar77);
    auVar70 = vaddps_avx512vl(auVar70,auVar71);
    auVar71 = vmulps_avx512vl(auVar145,auVar72);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar137,auVar70);
    auVar84 = vmulps_avx512vl(auVar79,auVar72);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar120,auVar70);
    auVar85 = vmulps_avx512vl(auVar78,auVar72);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar73,auVar70);
    auVar86 = vmulps_avx512vl(auVar77,auVar72);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar75,auVar70);
    auVar88 = vmulps_avx512vl(auVar82,auVar72);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar83,auVar70);
    auVar89 = vmulps_avx512vl(auVar81,auVar72);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar198,auVar70);
    auVar90 = vmulps_avx512vl(auVar87,auVar72);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar74,auVar70);
    auVar72 = vmulps_avx512vl(auVar80,auVar72);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar76,auVar70);
    auVar70 = vminps_avx512vl(auVar71,auVar84);
    auVar71 = vmaxps_avx512vl(auVar71,auVar84);
    auVar84 = vminps_avx512vl(auVar85,auVar86);
    auVar70 = vminps_avx512vl(auVar70,auVar84);
    auVar84 = vmaxps_avx512vl(auVar85,auVar86);
    auVar71 = vmaxps_avx512vl(auVar71,auVar84);
    auVar84 = vminps_avx512vl(auVar88,auVar89);
    auVar85 = vmaxps_avx512vl(auVar88,auVar89);
    auVar86 = vminps_avx512vl(auVar90,auVar72);
    auVar84 = vminps_avx512vl(auVar84,auVar86);
    auVar70 = vminps_avx512vl(auVar70,auVar84);
    auVar72 = vmaxps_avx512vl(auVar90,auVar72);
    auVar72 = vmaxps_avx512vl(auVar85,auVar72);
    auVar72 = vmaxps_avx512vl(auVar71,auVar72);
    uVar13 = vcmpps_avx512vl(auVar70,local_148,2);
    uVar14 = vcmpps_avx512vl(auVar72,local_168,5);
    bVar27 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar27 == 0) {
      auVar57 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar72 = vsubps_avx512vl(auVar75,auVar137);
      auVar70 = vsubps_avx512vl(auVar77,auVar145);
      auVar71 = vsubps_avx512vl(auVar76,auVar83);
      auVar72 = vaddps_avx512vl(auVar72,auVar71);
      auVar71 = vsubps_avx512vl(auVar80,auVar82);
      auVar70 = vaddps_avx512vl(auVar70,auVar71);
      auVar71 = vmulps_avx512vl(auVar145,auVar72);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar137);
      auVar79 = vmulps_avx512vl(auVar79,auVar72);
      auVar79 = vfnmadd213ps_avx512vl(auVar120,auVar70,auVar79);
      auVar78 = vmulps_avx512vl(auVar78,auVar72);
      auVar78 = vfnmadd213ps_avx512vl(auVar73,auVar70,auVar78);
      auVar73 = vmulps_avx512vl(auVar77,auVar72);
      auVar77 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar75);
      auVar73 = vmulps_avx512vl(auVar82,auVar72);
      auVar82 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar83);
      auVar73 = vmulps_avx512vl(auVar81,auVar72);
      auVar81 = vfnmadd213ps_avx512vl(auVar198,auVar70,auVar73);
      auVar73 = vmulps_avx512vl(auVar87,auVar72);
      auVar83 = vfnmadd213ps_avx512vl(auVar74,auVar70,auVar73);
      auVar74 = vmulps_avx512vl(auVar80,auVar72);
      auVar80 = vfnmadd231ps_avx512vl(auVar74,auVar76,auVar70);
      auVar73 = vminps_avx(auVar71,auVar79);
      auVar74 = vmaxps_avx(auVar71,auVar79);
      auVar75 = vminps_avx(auVar78,auVar77);
      auVar75 = vminps_avx(auVar73,auVar75);
      auVar73 = vmaxps_avx(auVar78,auVar77);
      auVar74 = vmaxps_avx(auVar74,auVar73);
      auVar87 = vminps_avx(auVar82,auVar81);
      auVar73 = vmaxps_avx(auVar82,auVar81);
      auVar76 = vminps_avx(auVar83,auVar80);
      auVar87 = vminps_avx(auVar87,auVar76);
      auVar87 = vminps_avx(auVar75,auVar87);
      auVar75 = vmaxps_avx(auVar83,auVar80);
      auVar73 = vmaxps_avx(auVar73,auVar75);
      auVar74 = vmaxps_avx(auVar74,auVar73);
      uVar13 = vcmpps_avx512vl(auVar74,local_168,5);
      uVar14 = vcmpps_avx512vl(auVar87,local_148,2);
      bVar27 = bVar27 & (byte)uVar13 & (byte)uVar14;
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      if (bVar27 != 0) {
        auStack_328[uVar30] = (uint)bVar27;
        uVar13 = vmovlps_avx(auVar43);
        (&uStack_128)[uVar30] = uVar13;
        uVar42 = vmovlps_avx(auVar63);
        auStack_58[uVar30] = uVar42;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
      auVar57 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar253 = ZEXT1664(auVar43);
    auVar249 = ZEXT3264(_DAT_01feed20);
    auVar248 = ZEXT1664(auVar65);
    auVar247 = ZEXT1664(auVar56);
    auVar246 = ZEXT3264(auVar74);
    auVar245 = ZEXT1664(auVar57);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar252 = ZEXT1664(auVar43);
LAB_01e1ec43:
    do {
      do {
        do {
          auVar56 = auVar245._0_16_;
          if ((int)uVar30 == 0) {
            uVar105 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar18._4_4_ = uVar105;
            auVar18._0_4_ = uVar105;
            auVar18._8_4_ = uVar105;
            auVar18._12_4_ = uVar105;
            auVar18._16_4_ = uVar105;
            auVar18._20_4_ = uVar105;
            auVar18._24_4_ = uVar105;
            auVar18._28_4_ = uVar105;
            uVar13 = vcmpps_avx512vl(local_78,auVar18,2);
            uVar37 = (uint)uVar36 & (uint)uVar36 + 0xff & (uint)uVar13;
            uVar36 = (ulong)uVar37;
            if (uVar37 == 0) {
              return;
            }
            goto LAB_01e1dba4;
          }
          uVar28 = (int)uVar30 - 1;
          uVar31 = (ulong)uVar28;
          uVar6 = auStack_328[uVar31];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = auStack_58[uVar31];
          uVar42 = 0;
          for (uVar35 = (ulong)uVar6; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000)
          {
            uVar42 = uVar42 + 1;
          }
          uVar33 = uVar6 - 1 & uVar6;
          bVar40 = uVar33 == 0;
          auStack_328[uVar31] = uVar33;
          if (bVar40) {
            uVar30 = (ulong)uVar28;
          }
          auVar107._8_8_ = 0;
          auVar107._0_8_ = uVar42;
          auVar43 = vpunpcklqdq_avx(auVar107,ZEXT416((int)uVar42 + 1));
          auVar43 = vcvtqq2ps_avx512vl(auVar43);
          auVar43 = vmulps_avx512vl(auVar43,auVar247._0_16_);
          uVar105 = *(undefined4 *)((long)&uStack_128 + uVar31 * 8 + 4);
          auVar15._4_4_ = uVar105;
          auVar15._0_4_ = uVar105;
          auVar15._8_4_ = uVar105;
          auVar15._12_4_ = uVar105;
          auVar57 = vmulps_avx512vl(auVar43,auVar15);
          auVar65 = auVar248._0_16_;
          auVar43 = vsubps_avx512vl(auVar65,auVar43);
          uVar105 = *(undefined4 *)(&uStack_128 + uVar31);
          auVar16._4_4_ = uVar105;
          auVar16._0_4_ = uVar105;
          auVar16._8_4_ = uVar105;
          auVar16._12_4_ = uVar105;
          auVar43 = vfmadd231ps_avx512vl(auVar57,auVar43,auVar16);
          auVar57 = vmovshdup_avx(auVar43);
          fVar213 = auVar57._0_4_ - auVar43._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar213));
          if (uVar6 == 0 || bVar40) goto LAB_01e1e6ef;
          auVar57 = vshufps_avx(auVar63,auVar63,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar213));
          auVar48 = vsubps_avx512vl(auVar65,auVar57);
          fVar199 = auVar57._0_4_;
          auVar140._0_4_ = fVar199 * fVar111;
          fVar208 = auVar57._4_4_;
          auVar140._4_4_ = fVar208 * fVar112;
          fVar209 = auVar57._8_4_;
          auVar140._8_4_ = fVar209 * fVar111;
          fVar210 = auVar57._12_4_;
          auVar140._12_4_ = fVar210 * fVar112;
          auVar152._0_4_ = fVar199 * fVar113;
          auVar152._4_4_ = fVar208 * fVar121;
          auVar152._8_4_ = fVar209 * fVar113;
          auVar152._12_4_ = fVar210 * fVar121;
          auVar161._0_4_ = fVar199 * fVar148;
          auVar161._4_4_ = fVar208 * fVar157;
          auVar161._8_4_ = fVar209 * fVar148;
          auVar161._12_4_ = fVar210 * fVar157;
          auVar124._0_4_ = fVar199 * fVar158;
          auVar124._4_4_ = fVar208 * fVar166;
          auVar124._8_4_ = fVar209 * fVar158;
          auVar124._12_4_ = fVar210 * fVar166;
          auVar57 = vfmadd231ps_fma(auVar140,auVar48,auVar44);
          auVar66 = vfmadd231ps_fma(auVar152,auVar48,auVar55);
          auVar45 = vfmadd231ps_fma(auVar161,auVar48,auVar58);
          auVar46 = vfmadd231ps_avx512vl(auVar124,auVar60,auVar48);
          auVar138._16_16_ = auVar57;
          auVar138._0_16_ = auVar57;
          auVar146._16_16_ = auVar66;
          auVar146._0_16_ = auVar66;
          auVar156._16_16_ = auVar45;
          auVar156._0_16_ = auVar45;
          auVar73 = vpermps_avx512vl(auVar249._0_32_,ZEXT1632(auVar43));
          auVar74 = vsubps_avx(auVar146,auVar138);
          auVar66 = vfmadd213ps_fma(auVar74,auVar73,auVar138);
          auVar74 = vsubps_avx(auVar156,auVar146);
          auVar48 = vfmadd213ps_fma(auVar74,auVar73,auVar146);
          auVar57 = vsubps_avx(auVar46,auVar45);
          auVar147._16_16_ = auVar57;
          auVar147._0_16_ = auVar57;
          auVar57 = vfmadd213ps_fma(auVar147,auVar73,auVar156);
          auVar74 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar66));
          auVar66 = vfmadd213ps_fma(auVar74,auVar73,ZEXT1632(auVar66));
          auVar74 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar48));
          auVar57 = vfmadd213ps_fma(auVar74,auVar73,ZEXT1632(auVar48));
          auVar74 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar66));
          auVar54 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar74,auVar73);
          auVar74 = vmulps_avx512vl(auVar74,auVar246._0_32_);
          auVar92._16_16_ = auVar74._16_16_;
          auVar57 = vmulss_avx512f(ZEXT416((uint)fVar213),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar199 = auVar57._0_4_;
          auVar162._0_8_ =
               CONCAT44(auVar54._4_4_ + fVar199 * auVar74._4_4_,
                        auVar54._0_4_ + fVar199 * auVar74._0_4_);
          auVar162._8_4_ = auVar54._8_4_ + fVar199 * auVar74._8_4_;
          auVar162._12_4_ = auVar54._12_4_ + fVar199 * auVar74._12_4_;
          auVar141._0_4_ = fVar199 * auVar74._16_4_;
          auVar141._4_4_ = fVar199 * auVar74._20_4_;
          auVar141._8_4_ = fVar199 * auVar74._24_4_;
          auVar141._12_4_ = fVar199 * auVar74._28_4_;
          auVar51 = vsubps_avx((undefined1  [16])0x0,auVar141);
          auVar46 = vshufpd_avx(auVar54,auVar54,3);
          auVar47 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar57 = vsubps_avx(auVar46,auVar54);
          auVar66 = vsubps_avx(auVar47,(undefined1  [16])0x0);
          auVar180._0_4_ = auVar57._0_4_ + auVar66._0_4_;
          auVar180._4_4_ = auVar57._4_4_ + auVar66._4_4_;
          auVar180._8_4_ = auVar57._8_4_ + auVar66._8_4_;
          auVar180._12_4_ = auVar57._12_4_ + auVar66._12_4_;
          auVar57 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar66 = vshufps_avx(auVar162,auVar162,0xb1);
          auVar45 = vshufps_avx(auVar51,auVar51,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar233._4_4_ = auVar180._0_4_;
          auVar233._0_4_ = auVar180._0_4_;
          auVar233._8_4_ = auVar180._0_4_;
          auVar233._12_4_ = auVar180._0_4_;
          auVar49 = vshufps_avx(auVar180,auVar180,0x55);
          fVar199 = auVar49._0_4_;
          auVar192._0_4_ = auVar57._0_4_ * fVar199;
          fVar208 = auVar49._4_4_;
          auVar192._4_4_ = auVar57._4_4_ * fVar208;
          fVar209 = auVar49._8_4_;
          auVar192._8_4_ = auVar57._8_4_ * fVar209;
          fVar210 = auVar49._12_4_;
          auVar192._12_4_ = auVar57._12_4_ * fVar210;
          auVar201._0_4_ = auVar66._0_4_ * fVar199;
          auVar201._4_4_ = auVar66._4_4_ * fVar208;
          auVar201._8_4_ = auVar66._8_4_ * fVar209;
          auVar201._12_4_ = auVar66._12_4_ * fVar210;
          auVar216._0_4_ = auVar45._0_4_ * fVar199;
          auVar216._4_4_ = auVar45._4_4_ * fVar208;
          auVar216._8_4_ = auVar45._8_4_ * fVar209;
          auVar216._12_4_ = auVar45._12_4_ * fVar210;
          auVar181._0_4_ = auVar48._0_4_ * fVar199;
          auVar181._4_4_ = auVar48._4_4_ * fVar208;
          auVar181._8_4_ = auVar48._8_4_ * fVar209;
          auVar181._12_4_ = auVar48._12_4_ * fVar210;
          auVar57 = vfmadd231ps_fma(auVar192,auVar233,auVar54);
          auVar66 = vfmadd231ps_fma(auVar201,auVar233,auVar162);
          auVar52 = vfmadd231ps_fma(auVar216,auVar233,auVar51);
          auVar53 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar233);
          auVar49 = vshufpd_avx(auVar57,auVar57,1);
          auVar50 = vshufpd_avx(auVar66,auVar66,1);
          auVar61 = vshufpd_avx512vl(auVar52,auVar52,1);
          auVar67 = vshufpd_avx512vl(auVar53,auVar53,1);
          auVar45 = vminss_avx(auVar57,auVar66);
          auVar57 = vmaxss_avx(auVar66,auVar57);
          auVar48 = vminss_avx(auVar52,auVar53);
          auVar66 = vmaxss_avx(auVar53,auVar52);
          auVar45 = vminss_avx(auVar45,auVar48);
          auVar57 = vmaxss_avx(auVar66,auVar57);
          auVar48 = vminss_avx(auVar49,auVar50);
          auVar66 = vmaxss_avx(auVar50,auVar49);
          auVar49 = vminss_avx512f(auVar61,auVar67);
          auVar50 = vmaxss_avx512f(auVar67,auVar61);
          auVar66 = vmaxss_avx(auVar50,auVar66);
          auVar48 = vminss_avx512f(auVar48,auVar49);
          fVar208 = auVar66._0_4_;
          fVar199 = auVar57._0_4_;
          if (auVar45._0_4_ < 0.0001) {
            bVar41 = fVar208 == -0.0001;
            bVar38 = NAN(fVar208);
            if (fVar208 <= -0.0001) goto LAB_01e1ee71;
            break;
          }
LAB_01e1ee71:
          vucomiss_avx512f(auVar48);
          bVar41 = fVar208 <= -0.0001;
          bVar39 = -0.0001 < fVar199;
          bVar38 = bVar41;
          if (!bVar41) break;
          uVar13 = vcmpps_avx512vl(auVar45,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar14 = vcmpps_avx512vl(auVar48,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar27 = (byte)uVar13 & (byte)uVar14 & 1;
          bVar41 = bVar39 && bVar27 == 0;
          bVar38 = bVar39 && bVar27 == 0;
        } while (!bVar39 || bVar27 != 0);
        vcmpss_avx512f(auVar45,auVar56,1);
        auVar52 = auVar250._0_16_;
        uVar13 = vcmpss_avx512f(auVar57,auVar56,1);
        bVar39 = (bool)((byte)uVar13 & 1);
        auVar92._0_16_ = auVar52;
        iVar103 = auVar250._0_4_;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar103);
        vucomiss_avx512f(auVar91._0_16_);
        bVar38 = (bool)(!bVar41 | bVar38);
        bVar39 = bVar38 == false;
        auVar94._16_16_ = auVar92._16_16_;
        auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar38 * auVar245._0_4_ + (uint)!bVar38 * 0x7f800000;
        auVar50 = auVar93._0_16_;
        auVar96._16_16_ = auVar92._16_16_;
        auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar38 * auVar245._0_4_ + (uint)!bVar38 * -0x800000;
        auVar49 = auVar95._0_16_;
        uVar13 = vcmpss_avx512f(auVar48,auVar56,1);
        bVar41 = (bool)((byte)uVar13 & 1);
        auVar98._16_16_ = auVar92._16_16_;
        auVar98._0_16_ = auVar52;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar103);
        vucomiss_avx512f(auVar97._0_16_);
        if ((bVar38) || (bVar39)) {
          auVar48 = vucomiss_avx512f(auVar45);
          if ((bVar38) || (bVar39)) {
            auVar53 = vxorps_avx512vl(auVar45,auVar252._0_16_);
            auVar45 = vsubss_avx512f(auVar48,auVar45);
            auVar45 = vdivss_avx512f(auVar53,auVar45);
            auVar48 = vsubss_avx512f(auVar52,auVar45);
            auVar45 = vfmadd213ss_avx512f(auVar48,auVar56,auVar45);
            auVar48 = auVar45;
          }
          else {
            auVar48 = vxorps_avx512vl(auVar48,auVar48);
            vucomiss_avx512f(auVar48);
            if ((bVar38) || (auVar45 = auVar52, bVar39)) {
              auVar45 = SUB6416(ZEXT464(0xff800000),0);
              auVar48 = ZEXT416(0x7f800000);
            }
          }
          auVar50 = vminss_avx512f(auVar50,auVar48);
          auVar49 = vmaxss_avx(auVar45,auVar49);
        }
        uVar13 = vcmpss_avx512f(auVar66,auVar56,1);
        bVar41 = (bool)((byte)uVar13 & 1);
        fVar209 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar103);
        if ((auVar91._0_4_ != fVar209) || (NAN(auVar91._0_4_) || NAN(fVar209))) {
          if ((fVar208 != fVar199) || (NAN(fVar208) || NAN(fVar199))) {
            auVar57 = vxorps_avx512vl(auVar57,auVar252._0_16_);
            auVar182._0_4_ = auVar57._0_4_ / (fVar208 - fVar199);
            auVar182._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar52,auVar182);
            auVar57 = vfmadd213ss_avx512f(auVar57,auVar56,auVar182);
            auVar66 = auVar57;
          }
          else if ((fVar199 != 0.0) ||
                  (auVar57 = auVar52, auVar66 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
            auVar57 = SUB6416(ZEXT464(0xff800000),0);
            auVar66 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar50 = vminss_avx(auVar50,auVar66);
          auVar49 = vmaxss_avx(auVar57,auVar49);
        }
        bVar41 = auVar97._0_4_ != fVar209;
        auVar57 = vminss_avx512f(auVar50,auVar52);
        auVar100._16_16_ = auVar92._16_16_;
        auVar100._0_16_ = auVar50;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar41 * auVar57._0_4_ + (uint)!bVar41 * auVar50._0_4_;
        auVar57 = vmaxss_avx512f(auVar52,auVar49);
        auVar102._16_16_ = auVar92._16_16_;
        auVar102._0_16_ = auVar49;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar41 * auVar57._0_4_ + (uint)!bVar41 * auVar49._0_4_;
        auVar57 = vmaxss_avx512f(auVar56,auVar99._0_16_);
        auVar66 = vminss_avx512f(auVar101._0_16_,auVar52);
      } while (auVar66._0_4_ < auVar57._0_4_);
      auVar50 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
      auVar53 = vminss_avx512f(ZEXT416((uint)(auVar66._0_4_ + 0.1)),auVar52);
      auVar125._0_8_ = auVar54._0_8_;
      auVar125._8_8_ = auVar125._0_8_;
      auVar202._8_8_ = auVar162._0_8_;
      auVar202._0_8_ = auVar162._0_8_;
      auVar217._8_8_ = auVar51._0_8_;
      auVar217._0_8_ = auVar51._0_8_;
      auVar57 = vshufpd_avx(auVar162,auVar162,3);
      auVar66 = vshufpd_avx(auVar51,auVar51,3);
      auVar45 = vshufps_avx(auVar50,auVar53,0);
      auVar49 = vsubps_avx512vl(auVar65,auVar45);
      fVar199 = auVar45._0_4_;
      auVar153._0_4_ = fVar199 * auVar46._0_4_;
      fVar208 = auVar45._4_4_;
      auVar153._4_4_ = fVar208 * auVar46._4_4_;
      fVar209 = auVar45._8_4_;
      auVar153._8_4_ = fVar209 * auVar46._8_4_;
      fVar210 = auVar45._12_4_;
      auVar153._12_4_ = fVar210 * auVar46._12_4_;
      auVar163._0_4_ = fVar199 * auVar57._0_4_;
      auVar163._4_4_ = fVar208 * auVar57._4_4_;
      auVar163._8_4_ = fVar209 * auVar57._8_4_;
      auVar163._12_4_ = fVar210 * auVar57._12_4_;
      auVar239._0_4_ = auVar66._0_4_ * fVar199;
      auVar239._4_4_ = auVar66._4_4_ * fVar208;
      auVar239._8_4_ = auVar66._8_4_ * fVar209;
      auVar239._12_4_ = auVar66._12_4_ * fVar210;
      auVar142._0_4_ = fVar199 * auVar47._0_4_;
      auVar142._4_4_ = fVar208 * auVar47._4_4_;
      auVar142._8_4_ = fVar209 * auVar47._8_4_;
      auVar142._12_4_ = fVar210 * auVar47._12_4_;
      auVar48 = vfmadd231ps_fma(auVar153,auVar49,auVar125);
      auVar46 = vfmadd231ps_fma(auVar163,auVar49,auVar202);
      auVar47 = vfmadd231ps_fma(auVar239,auVar49,auVar217);
      auVar49 = vfmadd231ps_fma(auVar142,auVar49,ZEXT816(0));
      auVar66 = vsubss_avx512f(auVar52,auVar50);
      auVar57 = vmovshdup_avx(auVar63);
      auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar50._0_4_)),auVar63,auVar66);
      auVar66 = vsubss_avx512f(auVar52,auVar53);
      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar53._0_4_)),auVar63,auVar66);
      auVar50 = vdivss_avx512f(auVar52,ZEXT416((uint)fVar213));
      auVar57 = vsubps_avx(auVar46,auVar48);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar66 = vmulps_avx512vl(auVar57,auVar51);
      auVar57 = vsubps_avx(auVar47,auVar46);
      auVar45 = vmulps_avx512vl(auVar57,auVar51);
      auVar57 = vsubps_avx(auVar49,auVar47);
      auVar57 = vmulps_avx512vl(auVar57,auVar51);
      auVar63 = vminps_avx(auVar45,auVar57);
      auVar57 = vmaxps_avx(auVar45,auVar57);
      auVar63 = vminps_avx(auVar66,auVar63);
      auVar57 = vmaxps_avx(auVar66,auVar57);
      auVar66 = vshufpd_avx(auVar63,auVar63,3);
      auVar45 = vshufpd_avx(auVar57,auVar57,3);
      auVar63 = vminps_avx(auVar63,auVar66);
      auVar57 = vmaxps_avx(auVar57,auVar45);
      fVar213 = auVar50._0_4_;
      auVar183._0_4_ = auVar63._0_4_ * fVar213;
      auVar183._4_4_ = auVar63._4_4_ * fVar213;
      auVar183._8_4_ = auVar63._8_4_ * fVar213;
      auVar183._12_4_ = auVar63._12_4_ * fVar213;
      auVar174._0_4_ = fVar213 * auVar57._0_4_;
      auVar174._4_4_ = fVar213 * auVar57._4_4_;
      auVar174._8_4_ = fVar213 * auVar57._8_4_;
      auVar174._12_4_ = fVar213 * auVar57._12_4_;
      auVar50 = vdivss_avx512f(auVar52,ZEXT416((uint)(auVar61._0_4_ - auVar54._0_4_)));
      auVar57 = vshufpd_avx(auVar48,auVar48,3);
      auVar63 = vshufpd_avx(auVar46,auVar46,3);
      auVar66 = vshufpd_avx(auVar47,auVar47,3);
      auVar45 = vshufpd_avx(auVar49,auVar49,3);
      auVar57 = vsubps_avx(auVar57,auVar48);
      auVar48 = vsubps_avx(auVar63,auVar46);
      auVar46 = vsubps_avx(auVar66,auVar47);
      auVar45 = vsubps_avx(auVar45,auVar49);
      auVar63 = vminps_avx(auVar57,auVar48);
      auVar57 = vmaxps_avx(auVar57,auVar48);
      auVar66 = vminps_avx(auVar46,auVar45);
      auVar66 = vminps_avx(auVar63,auVar66);
      auVar63 = vmaxps_avx(auVar46,auVar45);
      auVar57 = vmaxps_avx(auVar57,auVar63);
      fVar213 = auVar50._0_4_;
      auVar218._0_4_ = fVar213 * auVar66._0_4_;
      auVar218._4_4_ = fVar213 * auVar66._4_4_;
      auVar218._8_4_ = fVar213 * auVar66._8_4_;
      auVar218._12_4_ = fVar213 * auVar66._12_4_;
      auVar203._0_4_ = fVar213 * auVar57._0_4_;
      auVar203._4_4_ = fVar213 * auVar57._4_4_;
      auVar203._8_4_ = fVar213 * auVar57._8_4_;
      auVar203._12_4_ = fVar213 * auVar57._12_4_;
      auVar45 = vinsertps_avx(auVar43,auVar54,0x10);
      auVar67 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar61);
      auVar115._0_4_ = auVar45._0_4_ + auVar67._0_4_;
      auVar115._4_4_ = auVar45._4_4_ + auVar67._4_4_;
      auVar115._8_4_ = auVar45._8_4_ + auVar67._8_4_;
      auVar115._12_4_ = auVar45._12_4_ + auVar67._12_4_;
      auVar50 = vmulps_avx512vl(auVar115,auVar253._0_16_);
      auVar63 = vshufps_avx(auVar50,auVar50,0x54);
      uVar105 = auVar50._0_4_;
      auVar117._4_4_ = uVar105;
      auVar117._0_4_ = uVar105;
      auVar117._8_4_ = uVar105;
      auVar117._12_4_ = uVar105;
      auVar46 = vfmadd213ps_avx512vl(local_188,auVar117,auVar59);
      auVar66 = vfmadd213ps_fma(local_198,auVar117,local_338);
      auVar48 = vfmadd213ps_fma(local_1a8,auVar117,local_348);
      auVar57 = vsubps_avx(auVar66,auVar46);
      auVar46 = vfmadd213ps_fma(auVar57,auVar117,auVar46);
      auVar57 = vsubps_avx(auVar48,auVar66);
      auVar57 = vfmadd213ps_fma(auVar57,auVar117,auVar66);
      auVar57 = vsubps_avx(auVar57,auVar46);
      auVar66 = vfmadd231ps_fma(auVar46,auVar57,auVar117);
      auVar47 = vmulps_avx512vl(auVar57,auVar51);
      auVar226._8_8_ = auVar66._0_8_;
      auVar226._0_8_ = auVar66._0_8_;
      auVar57 = vshufpd_avx(auVar66,auVar66,3);
      auVar66 = vshufps_avx(auVar50,auVar50,0x55);
      auVar48 = vsubps_avx(auVar57,auVar226);
      auVar46 = vfmadd231ps_fma(auVar226,auVar66,auVar48);
      auVar240._8_8_ = auVar47._0_8_;
      auVar240._0_8_ = auVar47._0_8_;
      auVar57 = vshufpd_avx(auVar47,auVar47,3);
      auVar57 = vsubps_avx512vl(auVar57,auVar240);
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar66,auVar240);
      auVar118._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
      auVar118._8_4_ = auVar48._8_4_ ^ 0x80000000;
      auVar118._12_4_ = auVar48._12_4_ ^ 0x80000000;
      auVar66 = vmovshdup_avx512vl(auVar57);
      auVar241._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = auVar66._8_4_ ^ 0x80000000;
      auVar241._12_4_ = auVar66._12_4_ ^ 0x80000000;
      auVar47 = vmovshdup_avx512vl(auVar48);
      auVar49 = vpermt2ps_avx512vl(auVar241,ZEXT416(5),auVar48);
      auVar66 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar66._0_4_ * auVar48._0_4_)),auVar57,auVar47);
      auVar48 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar118);
      auVar143._0_4_ = auVar66._0_4_;
      auVar143._4_4_ = auVar143._0_4_;
      auVar143._8_4_ = auVar143._0_4_;
      auVar143._12_4_ = auVar143._0_4_;
      auVar57 = vdivps_avx(auVar49,auVar143);
      auVar68 = vdivps_avx512vl(auVar48,auVar143);
      fVar213 = auVar46._0_4_;
      auVar66 = vshufps_avx(auVar46,auVar46,0x55);
      auVar227._0_4_ = fVar213 * auVar57._0_4_ + auVar66._0_4_ * auVar68._0_4_;
      auVar227._4_4_ = fVar213 * auVar57._4_4_ + auVar66._4_4_ * auVar68._4_4_;
      auVar227._8_4_ = fVar213 * auVar57._8_4_ + auVar66._8_4_ * auVar68._8_4_;
      auVar227._12_4_ = fVar213 * auVar57._12_4_ + auVar66._12_4_ * auVar68._12_4_;
      auVar51 = vsubps_avx(auVar63,auVar227);
      auVar66 = vmovshdup_avx(auVar57);
      auVar63 = vinsertps_avx(auVar183,auVar218,0x1c);
      auVar242._0_4_ = auVar66._0_4_ * auVar63._0_4_;
      auVar242._4_4_ = auVar66._4_4_ * auVar63._4_4_;
      auVar242._8_4_ = auVar66._8_4_ * auVar63._8_4_;
      auVar242._12_4_ = auVar66._12_4_ * auVar63._12_4_;
      auVar53 = vinsertps_avx512f(auVar174,auVar203,0x1c);
      auVar66 = vmulps_avx512vl(auVar66,auVar53);
      auVar49 = vminps_avx512vl(auVar242,auVar66);
      auVar46 = vmaxps_avx(auVar66,auVar242);
      auVar47 = vmovshdup_avx(auVar68);
      auVar66 = vinsertps_avx(auVar218,auVar183,0x4c);
      auVar219._0_4_ = auVar47._0_4_ * auVar66._0_4_;
      auVar219._4_4_ = auVar47._4_4_ * auVar66._4_4_;
      auVar219._8_4_ = auVar47._8_4_ * auVar66._8_4_;
      auVar219._12_4_ = auVar47._12_4_ * auVar66._12_4_;
      auVar48 = vinsertps_avx(auVar203,auVar174,0x4c);
      auVar204._0_4_ = auVar47._0_4_ * auVar48._0_4_;
      auVar204._4_4_ = auVar47._4_4_ * auVar48._4_4_;
      auVar204._8_4_ = auVar47._8_4_ * auVar48._8_4_;
      auVar204._12_4_ = auVar47._12_4_ * auVar48._12_4_;
      auVar47 = vminps_avx(auVar219,auVar204);
      auVar49 = vaddps_avx512vl(auVar49,auVar47);
      auVar47 = vmaxps_avx(auVar204,auVar219);
      auVar205._0_4_ = auVar46._0_4_ + auVar47._0_4_;
      auVar205._4_4_ = auVar46._4_4_ + auVar47._4_4_;
      auVar205._8_4_ = auVar46._8_4_ + auVar47._8_4_;
      auVar205._12_4_ = auVar46._12_4_ + auVar47._12_4_;
      auVar220._8_8_ = 0x3f80000000000000;
      auVar220._0_8_ = 0x3f80000000000000;
      auVar46 = vsubps_avx(auVar220,auVar205);
      auVar47 = vsubps_avx(auVar220,auVar49);
      auVar49 = vsubps_avx(auVar45,auVar50);
      auVar50 = vsubps_avx(auVar67,auVar50);
      fVar210 = auVar49._0_4_;
      auVar243._0_4_ = fVar210 * auVar46._0_4_;
      fVar211 = auVar49._4_4_;
      auVar243._4_4_ = fVar211 * auVar46._4_4_;
      fVar212 = auVar49._8_4_;
      auVar243._8_4_ = fVar212 * auVar46._8_4_;
      fVar123 = auVar49._12_4_;
      auVar243._12_4_ = fVar123 * auVar46._12_4_;
      auVar69 = vbroadcastss_avx512vl(auVar57);
      auVar63 = vmulps_avx512vl(auVar69,auVar63);
      auVar53 = vmulps_avx512vl(auVar69,auVar53);
      auVar69 = vminps_avx512vl(auVar63,auVar53);
      auVar53 = vmaxps_avx512vl(auVar53,auVar63);
      auVar63 = vbroadcastss_avx512vl(auVar68);
      auVar66 = vmulps_avx512vl(auVar63,auVar66);
      auVar63 = vmulps_avx512vl(auVar63,auVar48);
      auVar48 = vminps_avx512vl(auVar66,auVar63);
      auVar48 = vaddps_avx512vl(auVar69,auVar48);
      auVar49 = vmulps_avx512vl(auVar49,auVar47);
      fVar213 = auVar50._0_4_;
      auVar206._0_4_ = fVar213 * auVar46._0_4_;
      fVar199 = auVar50._4_4_;
      auVar206._4_4_ = fVar199 * auVar46._4_4_;
      fVar208 = auVar50._8_4_;
      auVar206._8_4_ = fVar208 * auVar46._8_4_;
      fVar209 = auVar50._12_4_;
      auVar206._12_4_ = fVar209 * auVar46._12_4_;
      auVar221._0_4_ = fVar213 * auVar47._0_4_;
      auVar221._4_4_ = fVar199 * auVar47._4_4_;
      auVar221._8_4_ = fVar208 * auVar47._8_4_;
      auVar221._12_4_ = fVar209 * auVar47._12_4_;
      auVar63 = vmaxps_avx(auVar63,auVar66);
      auVar175._0_4_ = auVar53._0_4_ + auVar63._0_4_;
      auVar175._4_4_ = auVar53._4_4_ + auVar63._4_4_;
      auVar175._8_4_ = auVar53._8_4_ + auVar63._8_4_;
      auVar175._12_4_ = auVar53._12_4_ + auVar63._12_4_;
      auVar184._8_8_ = 0x3f800000;
      auVar184._0_8_ = 0x3f800000;
      auVar63 = vsubps_avx(auVar184,auVar175);
      auVar66 = vsubps_avx512vl(auVar184,auVar48);
      auVar234._0_4_ = fVar210 * auVar63._0_4_;
      auVar234._4_4_ = fVar211 * auVar63._4_4_;
      auVar234._8_4_ = fVar212 * auVar63._8_4_;
      auVar234._12_4_ = fVar123 * auVar63._12_4_;
      auVar228._0_4_ = fVar210 * auVar66._0_4_;
      auVar228._4_4_ = fVar211 * auVar66._4_4_;
      auVar228._8_4_ = fVar212 * auVar66._8_4_;
      auVar228._12_4_ = fVar123 * auVar66._12_4_;
      auVar176._0_4_ = fVar213 * auVar63._0_4_;
      auVar176._4_4_ = fVar199 * auVar63._4_4_;
      auVar176._8_4_ = fVar208 * auVar63._8_4_;
      auVar176._12_4_ = fVar209 * auVar63._12_4_;
      auVar185._0_4_ = fVar213 * auVar66._0_4_;
      auVar185._4_4_ = fVar199 * auVar66._4_4_;
      auVar185._8_4_ = fVar208 * auVar66._8_4_;
      auVar185._12_4_ = fVar209 * auVar66._12_4_;
      auVar63 = vminps_avx(auVar234,auVar228);
      auVar66 = vminps_avx512vl(auVar176,auVar185);
      auVar48 = vminps_avx512vl(auVar63,auVar66);
      auVar63 = vmaxps_avx(auVar228,auVar234);
      auVar66 = vmaxps_avx(auVar185,auVar176);
      auVar66 = vmaxps_avx(auVar66,auVar63);
      auVar46 = vminps_avx512vl(auVar243,auVar49);
      auVar63 = vminps_avx(auVar206,auVar221);
      auVar63 = vminps_avx(auVar46,auVar63);
      auVar63 = vhaddps_avx(auVar48,auVar63);
      auVar46 = vmaxps_avx512vl(auVar49,auVar243);
      auVar48 = vmaxps_avx(auVar221,auVar206);
      auVar48 = vmaxps_avx(auVar48,auVar46);
      auVar66 = vhaddps_avx(auVar66,auVar48);
      auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
      auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
      auVar177._0_4_ = auVar63._0_4_ + auVar51._0_4_;
      auVar177._4_4_ = auVar63._4_4_ + auVar51._4_4_;
      auVar177._8_4_ = auVar63._8_4_ + auVar51._8_4_;
      auVar177._12_4_ = auVar63._12_4_ + auVar51._12_4_;
      auVar186._0_4_ = auVar66._0_4_ + auVar51._0_4_;
      auVar186._4_4_ = auVar66._4_4_ + auVar51._4_4_;
      auVar186._8_4_ = auVar66._8_4_ + auVar51._8_4_;
      auVar186._12_4_ = auVar66._12_4_ + auVar51._12_4_;
      auVar63 = vmaxps_avx(auVar45,auVar177);
      auVar66 = vminps_avx(auVar186,auVar67);
      uVar42 = vcmpps_avx512vl(auVar66,auVar63,1);
    } while ((uVar42 & 3) != 0);
    uVar42 = vcmpps_avx512vl(auVar186,auVar67,1);
    uVar13 = vcmpps_avx512vl(auVar43,auVar177,1);
    if (((ushort)uVar13 & (ushort)uVar42 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar63 = vmovshdup_avx(auVar177);
      bVar27 = auVar54._0_4_ < auVar63._0_4_ & (byte)(uVar42 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar30 || uVar6 != 0 && !bVar40) | bVar27) == 1) {
      lVar32 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar52,auVar51);
        fVar208 = auVar43._0_4_;
        fVar213 = fVar208 * fVar208 * fVar208;
        auVar43 = vmulss_avx512f(auVar51,ZEXT416(0x40400000));
        fVar199 = auVar43._0_4_ * fVar208 * fVar208;
        fVar209 = auVar51._0_4_;
        auVar43 = vmulss_avx512f(ZEXT416((uint)(fVar209 * fVar209)),ZEXT416(0x40400000));
        fVar208 = fVar208 * auVar43._0_4_;
        auVar134._4_4_ = fVar213;
        auVar134._0_4_ = fVar213;
        auVar134._8_4_ = fVar213;
        auVar134._12_4_ = fVar213;
        auVar126._4_4_ = fVar199;
        auVar126._0_4_ = fVar199;
        auVar126._8_4_ = fVar199;
        auVar126._12_4_ = fVar199;
        auVar108._4_4_ = fVar208;
        auVar108._0_4_ = fVar208;
        auVar108._8_4_ = fVar208;
        auVar108._12_4_ = fVar208;
        fVar209 = fVar209 * fVar209 * fVar209;
        auVar154._0_4_ = (float)local_178._0_4_ * fVar209;
        auVar154._4_4_ = (float)local_178._4_4_ * fVar209;
        auVar154._8_4_ = fStack_170 * fVar209;
        auVar154._12_4_ = fStack_16c * fVar209;
        auVar43 = vfmadd231ps_fma(auVar154,local_348,auVar108);
        auVar43 = vfmadd231ps_fma(auVar43,local_338,auVar126);
        auVar43 = vfmadd231ps_fma(auVar43,auVar59,auVar134);
        auVar109._8_8_ = auVar43._0_8_;
        auVar109._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar63 = vshufps_avx(auVar51,auVar51,0x55);
        auVar43 = vsubps_avx(auVar43,auVar109);
        auVar63 = vfmadd213ps_fma(auVar43,auVar63,auVar109);
        fVar213 = auVar63._0_4_;
        auVar43 = vshufps_avx(auVar63,auVar63,0x55);
        auVar110._0_4_ = auVar57._0_4_ * fVar213 + auVar68._0_4_ * auVar43._0_4_;
        auVar110._4_4_ = auVar57._4_4_ * fVar213 + auVar68._4_4_ * auVar43._4_4_;
        auVar110._8_4_ = auVar57._8_4_ * fVar213 + auVar68._8_4_ * auVar43._8_4_;
        auVar110._12_4_ = auVar57._12_4_ * fVar213 + auVar68._12_4_ * auVar43._12_4_;
        auVar51 = vsubps_avx(auVar51,auVar110);
        auVar43 = vandps_avx512vl(auVar63,auVar251._0_16_);
        auVar63 = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar63,auVar43);
        bVar40 = fVar104 < auVar43._0_4_;
        if (auVar43._0_4_ < fVar104) {
          auVar43 = vucomiss_avx512f(auVar56);
          if (bVar40) break;
          auVar57 = vucomiss_avx512f(auVar43);
          auVar250 = ZEXT1664(auVar57);
          if (bVar40) break;
          vmovshdup_avx(auVar43);
          auVar57 = vucomiss_avx512f(auVar56);
          if (bVar40) break;
          auVar63 = vucomiss_avx512f(auVar57);
          auVar250 = ZEXT1664(auVar63);
          if (bVar40) break;
          auVar66 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar51 = vinsertps_avx(auVar66,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar66 = vdpps_avx(auVar51,local_1b8,0x7f);
          auVar45 = vdpps_avx(auVar51,local_1c8,0x7f);
          auVar48 = vdpps_avx(auVar51,local_1d8,0x7f);
          auVar46 = vdpps_avx(auVar51,local_1e8,0x7f);
          auVar47 = vdpps_avx(auVar51,local_1f8,0x7f);
          auVar49 = vdpps_avx(auVar51,local_208,0x7f);
          auVar50 = vdpps_avx(auVar51,local_218,0x7f);
          auVar51 = vdpps_avx(auVar51,local_228,0x7f);
          auVar52 = vsubss_avx512f(auVar63,auVar57);
          fVar209 = auVar57._0_4_;
          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar47._0_4_)),auVar52,auVar66);
          auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar209)),auVar52,auVar45);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar209)),auVar52,auVar48);
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar51._0_4_)),auVar52,auVar46);
          auVar63 = vsubss_avx512f(auVar63,auVar43);
          auVar187._0_4_ = auVar63._0_4_;
          fVar213 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
          auVar63 = vmulss_avx512f(auVar43,ZEXT416(0x40400000));
          fVar199 = auVar63._0_4_ * auVar187._0_4_ * auVar187._0_4_;
          local_d8 = auVar43._0_4_;
          auVar127._0_4_ = local_d8 * local_d8;
          auVar127._4_4_ = auVar43._4_4_ * auVar43._4_4_;
          auVar127._8_4_ = auVar43._8_4_ * auVar43._8_4_;
          auVar127._12_4_ = auVar43._12_4_ * auVar43._12_4_;
          auVar63 = vmulss_avx512f(auVar127,ZEXT416(0x40400000));
          fVar208 = auVar187._0_4_ * auVar63._0_4_;
          fVar211 = local_d8 * auVar127._0_4_;
          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar48._0_4_)),ZEXT416((uint)fVar208),
                                    auVar45);
          auVar63 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar199),auVar66);
          auVar57 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar213),auVar57);
          fVar210 = auVar57._0_4_;
          if ((fVar210 < fVar122) || (fVar212 = *(float *)(ray + k * 4 + 0x80), fVar212 < fVar210))
          break;
          local_c8 = vshufps_avx(auVar43,auVar43,0x55);
          auVar65 = vsubps_avx512vl(auVar65,local_c8);
          fVar123 = local_c8._0_4_;
          auVar193._0_4_ = fVar123 * (float)local_278._0_4_;
          fVar130 = local_c8._4_4_;
          auVar193._4_4_ = fVar130 * (float)local_278._4_4_;
          fVar131 = local_c8._8_4_;
          auVar193._8_4_ = fVar131 * fStack_270;
          fVar132 = local_c8._12_4_;
          auVar193._12_4_ = fVar132 * fStack_26c;
          auVar207._0_4_ = fVar123 * (float)local_288._0_4_;
          auVar207._4_4_ = fVar130 * (float)local_288._4_4_;
          auVar207._8_4_ = fVar131 * fStack_280;
          auVar207._12_4_ = fVar132 * fStack_27c;
          auVar222._0_4_ = fVar123 * (float)local_298._0_4_;
          auVar222._4_4_ = fVar130 * (float)local_298._4_4_;
          auVar222._8_4_ = fVar131 * fStack_290;
          auVar222._12_4_ = fVar132 * fStack_28c;
          auVar229._0_4_ = fVar123 * (float)local_2a8._0_4_;
          auVar229._4_4_ = fVar130 * (float)local_2a8._4_4_;
          auVar229._8_4_ = fVar131 * fStack_2a0;
          auVar229._12_4_ = fVar132 * fStack_29c;
          auVar43 = vfmadd231ps_fma(auVar193,auVar65,local_238);
          auVar57 = vfmadd231ps_fma(auVar207,auVar65,local_248);
          auVar63 = vfmadd231ps_fma(auVar222,auVar65,local_258);
          auVar65 = vfmadd231ps_fma(auVar229,auVar65,local_268);
          auVar43 = vsubps_avx(auVar57,auVar43);
          auVar57 = vsubps_avx(auVar63,auVar57);
          auVar63 = vsubps_avx(auVar65,auVar63);
          auVar230._0_4_ = local_d8 * auVar57._0_4_;
          auVar230._4_4_ = local_d8 * auVar57._4_4_;
          auVar230._8_4_ = local_d8 * auVar57._8_4_;
          auVar230._12_4_ = local_d8 * auVar57._12_4_;
          auVar187._4_4_ = auVar187._0_4_;
          auVar187._8_4_ = auVar187._0_4_;
          auVar187._12_4_ = auVar187._0_4_;
          auVar43 = vfmadd231ps_fma(auVar230,auVar187,auVar43);
          auVar194._0_4_ = local_d8 * auVar63._0_4_;
          auVar194._4_4_ = local_d8 * auVar63._4_4_;
          auVar194._8_4_ = local_d8 * auVar63._8_4_;
          auVar194._12_4_ = local_d8 * auVar63._12_4_;
          auVar57 = vfmadd231ps_fma(auVar194,auVar187,auVar57);
          auVar195._0_4_ = local_d8 * auVar57._0_4_;
          auVar195._4_4_ = local_d8 * auVar57._4_4_;
          auVar195._8_4_ = local_d8 * auVar57._8_4_;
          auVar195._12_4_ = local_d8 * auVar57._12_4_;
          auVar43 = vfmadd231ps_fma(auVar195,auVar187,auVar43);
          auVar17._8_4_ = 0x40400000;
          auVar17._0_8_ = 0x4040000040400000;
          auVar17._12_4_ = 0x40400000;
          auVar43 = vmulps_avx512vl(auVar43,auVar17);
          pGVar7 = (context->scene->geometries).items[uVar29].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
          auVar164._0_4_ = fVar211 * (float)local_2e8._0_4_;
          auVar164._4_4_ = fVar211 * (float)local_2e8._4_4_;
          auVar164._8_4_ = fVar211 * fStack_2e0;
          auVar164._12_4_ = fVar211 * fStack_2dc;
          auVar155._4_4_ = fVar208;
          auVar155._0_4_ = fVar208;
          auVar155._8_4_ = fVar208;
          auVar155._12_4_ = fVar208;
          auVar57 = vfmadd132ps_fma(auVar155,auVar164,local_2d8);
          auVar144._4_4_ = fVar199;
          auVar144._0_4_ = fVar199;
          auVar144._8_4_ = fVar199;
          auVar144._12_4_ = fVar199;
          auVar57 = vfmadd132ps_fma(auVar144,auVar57,local_2c8);
          auVar135._4_4_ = fVar213;
          auVar135._0_4_ = fVar213;
          auVar135._8_4_ = fVar213;
          auVar135._12_4_ = fVar213;
          auVar65 = vfmadd132ps_fma(auVar135,auVar57,local_2b8);
          auVar57 = vshufps_avx(auVar65,auVar65,0xc9);
          auVar63 = vshufps_avx(auVar43,auVar43,0xc9);
          auVar136._0_4_ = auVar65._0_4_ * auVar63._0_4_;
          auVar136._4_4_ = auVar65._4_4_ * auVar63._4_4_;
          auVar136._8_4_ = auVar65._8_4_ * auVar63._8_4_;
          auVar136._12_4_ = auVar65._12_4_ * auVar63._12_4_;
          auVar43 = vfmsub231ps_fma(auVar136,auVar43,auVar57);
          local_e8 = auVar43._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar210;
            uVar105 = vextractps_avx(auVar43,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar105;
            uVar105 = vextractps_avx(auVar43,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar105;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
            *(float *)(ray + k * 4 + 0xf0) = local_d8;
            *(float *)(ray + k * 4 + 0x100) = fVar209;
            *(uint *)(ray + k * 4 + 0x110) = uVar37;
            *(int *)(ray + k * 4 + 0x120) = (int)uVar29;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            break;
          }
          auVar57 = vshufps_avx(auVar43,auVar43,0x55);
          local_f8 = vshufps_avx(auVar43,auVar43,0xaa);
          local_108[0] = (RTCHitN)auVar57[0];
          local_108[1] = (RTCHitN)auVar57[1];
          local_108[2] = (RTCHitN)auVar57[2];
          local_108[3] = (RTCHitN)auVar57[3];
          local_108[4] = (RTCHitN)auVar57[4];
          local_108[5] = (RTCHitN)auVar57[5];
          local_108[6] = (RTCHitN)auVar57[6];
          local_108[7] = (RTCHitN)auVar57[7];
          local_108[8] = (RTCHitN)auVar57[8];
          local_108[9] = (RTCHitN)auVar57[9];
          local_108[10] = (RTCHitN)auVar57[10];
          local_108[0xb] = (RTCHitN)auVar57[0xb];
          local_108[0xc] = (RTCHitN)auVar57[0xc];
          local_108[0xd] = (RTCHitN)auVar57[0xd];
          local_108[0xe] = (RTCHitN)auVar57[0xe];
          local_108[0xf] = (RTCHitN)auVar57[0xf];
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          fStack_d4 = local_d8;
          fStack_d0 = local_d8;
          fStack_cc = local_d8;
          local_b8 = local_308._0_8_;
          uStack_b0 = local_308._8_8_;
          local_a8 = local_2f8;
          vpcmpeqd_avx2(ZEXT1632(local_2f8),ZEXT1632(local_2f8));
          uStack_94 = context->user->instID[0];
          local_98 = uStack_94;
          uStack_90 = uStack_94;
          uStack_8c = uStack_94;
          uStack_88 = context->user->instPrimID[0];
          uStack_84 = uStack_88;
          uStack_80 = uStack_88;
          uStack_7c = uStack_88;
          *(float *)(ray + k * 4 + 0x80) = fVar210;
          local_398 = local_318;
          local_378.valid = (int *)local_398;
          local_378.geometryUserPtr = pGVar7->userPtr;
          local_378.context = context->user;
          local_378.hit = local_108;
          local_378.N = 4;
          local_378.ray = (RTCRayN *)ray;
          if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_388 = uVar29;
            (*pGVar7->intersectionFilterN)(&local_378);
            auVar249 = ZEXT3264(_DAT_01feed20);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar248 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar247 = ZEXT1664(auVar43);
            auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar246 = ZEXT3264(auVar74);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar252 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar251 = ZEXT1664(auVar43);
            auVar250 = ZEXT464(0x3f800000);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar253 = ZEXT1664(auVar43);
            auVar43 = vxorps_avx512vl(auVar56,auVar56);
            auVar245 = ZEXT1664(auVar43);
            uVar29 = local_388;
          }
          auVar43 = auVar245._0_16_;
          uVar42 = vptestmd_avx512vl(local_398,local_398);
          if ((uVar42 & 0xf) != 0) {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var12)(&local_378);
              auVar249 = ZEXT3264(_DAT_01feed20);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar248 = ZEXT1664(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar247 = ZEXT1664(auVar56);
              auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar246 = ZEXT3264(auVar74);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar252 = ZEXT1664(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar251 = ZEXT1664(auVar56);
              auVar250 = ZEXT464(0x3f800000);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar253 = ZEXT1664(auVar56);
              auVar43 = vxorps_avx512vl(auVar43,auVar43);
              auVar245 = ZEXT1664(auVar43);
            }
            uVar42 = vptestmd_avx512vl(local_398,local_398);
            uVar42 = uVar42 & 0xf;
            bVar27 = (byte)uVar42;
            if (bVar27 != 0) {
              iVar103 = *(int *)(local_378.hit + 4);
              iVar25 = *(int *)(local_378.hit + 8);
              iVar26 = *(int *)(local_378.hit + 0xc);
              bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
              bVar38 = SUB81(uVar42 >> 3,0);
              *(uint *)(local_378.ray + 0xc0) =
                   (uint)(bVar27 & 1) * *(int *)local_378.hit |
                   (uint)!(bool)(bVar27 & 1) * *(int *)(local_378.ray + 0xc0);
              *(uint *)(local_378.ray + 0xc4) =
                   (uint)bVar40 * iVar103 | (uint)!bVar40 * *(int *)(local_378.ray + 0xc4);
              *(uint *)(local_378.ray + 200) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_378.ray + 200);
              *(uint *)(local_378.ray + 0xcc) =
                   (uint)bVar38 * iVar26 | (uint)!bVar38 * *(int *)(local_378.ray + 0xcc);
              iVar103 = *(int *)(local_378.hit + 0x14);
              iVar25 = *(int *)(local_378.hit + 0x18);
              iVar26 = *(int *)(local_378.hit + 0x1c);
              bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
              bVar38 = SUB81(uVar42 >> 3,0);
              *(uint *)(local_378.ray + 0xd0) =
                   (uint)(bVar27 & 1) * *(int *)(local_378.hit + 0x10) |
                   (uint)!(bool)(bVar27 & 1) * *(int *)(local_378.ray + 0xd0);
              *(uint *)(local_378.ray + 0xd4) =
                   (uint)bVar40 * iVar103 | (uint)!bVar40 * *(int *)(local_378.ray + 0xd4);
              *(uint *)(local_378.ray + 0xd8) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_378.ray + 0xd8);
              *(uint *)(local_378.ray + 0xdc) =
                   (uint)bVar38 * iVar26 | (uint)!bVar38 * *(int *)(local_378.ray + 0xdc);
              iVar103 = *(int *)(local_378.hit + 0x24);
              iVar25 = *(int *)(local_378.hit + 0x28);
              iVar26 = *(int *)(local_378.hit + 0x2c);
              bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
              bVar38 = SUB81(uVar42 >> 3,0);
              *(uint *)(local_378.ray + 0xe0) =
                   (uint)(bVar27 & 1) * *(int *)(local_378.hit + 0x20) |
                   (uint)!(bool)(bVar27 & 1) * *(int *)(local_378.ray + 0xe0);
              *(uint *)(local_378.ray + 0xe4) =
                   (uint)bVar40 * iVar103 | (uint)!bVar40 * *(int *)(local_378.ray + 0xe4);
              *(uint *)(local_378.ray + 0xe8) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_378.ray + 0xe8);
              *(uint *)(local_378.ray + 0xec) =
                   (uint)bVar38 * iVar26 | (uint)!bVar38 * *(int *)(local_378.ray + 0xec);
              iVar103 = *(int *)(local_378.hit + 0x34);
              iVar25 = *(int *)(local_378.hit + 0x38);
              iVar26 = *(int *)(local_378.hit + 0x3c);
              bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
              bVar38 = SUB81(uVar42 >> 3,0);
              *(uint *)(local_378.ray + 0xf0) =
                   (uint)(bVar27 & 1) * *(int *)(local_378.hit + 0x30) |
                   (uint)!(bool)(bVar27 & 1) * *(int *)(local_378.ray + 0xf0);
              *(uint *)(local_378.ray + 0xf4) =
                   (uint)bVar40 * iVar103 | (uint)!bVar40 * *(int *)(local_378.ray + 0xf4);
              *(uint *)(local_378.ray + 0xf8) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_378.ray + 0xf8);
              *(uint *)(local_378.ray + 0xfc) =
                   (uint)bVar38 * iVar26 | (uint)!bVar38 * *(int *)(local_378.ray + 0xfc);
              iVar103 = *(int *)(local_378.hit + 0x44);
              iVar25 = *(int *)(local_378.hit + 0x48);
              iVar26 = *(int *)(local_378.hit + 0x4c);
              bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
              bVar38 = SUB81(uVar42 >> 3,0);
              *(uint *)(local_378.ray + 0x100) =
                   (uint)(bVar27 & 1) * *(int *)(local_378.hit + 0x40) |
                   (uint)!(bool)(bVar27 & 1) * *(int *)(local_378.ray + 0x100);
              *(uint *)(local_378.ray + 0x104) =
                   (uint)bVar40 * iVar103 | (uint)!bVar40 * *(int *)(local_378.ray + 0x104);
              *(uint *)(local_378.ray + 0x108) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_378.ray + 0x108);
              *(uint *)(local_378.ray + 0x10c) =
                   (uint)bVar38 * iVar26 | (uint)!bVar38 * *(int *)(local_378.ray + 0x10c);
              auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x50));
              *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar43;
              auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x60));
              *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar43;
              auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x70));
              *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar43;
              auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x80));
              *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar43;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x80) = fVar212;
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01e1ec43;
    }
    auVar63 = vinsertps_avx(auVar54,auVar61,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }